

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<4>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined4 uVar84;
  vint4 bi_2;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vint4 bi_1;
  float fVar101;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  vint4 bi;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar121;
  float fVar122;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar123;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  vint4 ai_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vint4 ai_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  vfloat4 a0_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar192;
  float fVar203;
  float fVar205;
  float fVar207;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar204;
  float fVar206;
  float fVar208;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar220;
  float fVar221;
  vfloat4 a0;
  undefined1 auVar213 [16];
  float fVar222;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  vfloat4 a0_1;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_304;
  ulong local_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  RTCFilterFunctionNArguments local_298;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined8 uStack_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar23;
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar232 [32];
  
  PVar4 = prim[1];
  uVar28 = (ulong)(byte)PVar4;
  fVar211 = *(float *)(prim + uVar28 * 0x19 + 0x12);
  auVar35 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar28 * 0x19 + 6));
  auVar114._0_4_ = fVar211 * auVar35._0_4_;
  auVar114._4_4_ = fVar211 * auVar35._4_4_;
  auVar114._8_4_ = fVar211 * auVar35._8_4_;
  auVar114._12_4_ = fVar211 * auVar35._12_4_;
  auVar42._0_4_ = fVar211 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar42._4_4_ = fVar211 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar42._8_4_ = fVar211 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar42._12_4_ = fVar211 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 4 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 5 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 6 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0xb + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar28 + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  uVar34 = (ulong)(uint)((int)(uVar28 * 9) * 2);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 + uVar28 + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  uVar22 = (ulong)(uint)((int)(uVar28 * 5) << 2);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar223._4_4_ = auVar42._0_4_;
  auVar223._0_4_ = auVar42._0_4_;
  auVar223._8_4_ = auVar42._0_4_;
  auVar223._12_4_ = auVar42._0_4_;
  auVar51 = vshufps_avx(auVar42,auVar42,0x55);
  auVar38 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar211 = auVar38._0_4_;
  auVar49._0_4_ = fVar211 * auVar37._0_4_;
  fVar192 = auVar38._4_4_;
  auVar49._4_4_ = fVar192 * auVar37._4_4_;
  fVar204 = auVar38._8_4_;
  auVar49._8_4_ = fVar204 * auVar37._8_4_;
  fVar206 = auVar38._12_4_;
  auVar49._12_4_ = fVar206 * auVar37._12_4_;
  auVar50._0_4_ = auVar45._0_4_ * fVar211;
  auVar50._4_4_ = auVar45._4_4_ * fVar192;
  auVar50._8_4_ = auVar45._8_4_ * fVar204;
  auVar50._12_4_ = auVar45._12_4_ * fVar206;
  auVar85._0_4_ = auVar40._0_4_ * fVar211;
  auVar85._4_4_ = auVar40._4_4_ * fVar192;
  auVar85._8_4_ = auVar40._8_4_ * fVar204;
  auVar85._12_4_ = auVar40._12_4_ * fVar206;
  auVar38 = vfmadd231ps_fma(auVar49,auVar51,auVar36);
  auVar39 = vfmadd231ps_fma(auVar50,auVar51,auVar44);
  auVar51 = vfmadd231ps_fma(auVar85,auVar47,auVar51);
  auVar41 = vfmadd231ps_fma(auVar38,auVar223,auVar35);
  auVar39 = vfmadd231ps_fma(auVar39,auVar223,auVar46);
  auVar42 = vfmadd231ps_fma(auVar51,auVar43,auVar223);
  auVar224._4_4_ = auVar114._0_4_;
  auVar224._0_4_ = auVar114._0_4_;
  auVar224._8_4_ = auVar114._0_4_;
  auVar224._12_4_ = auVar114._0_4_;
  auVar51 = vshufps_avx(auVar114,auVar114,0x55);
  auVar38 = vshufps_avx(auVar114,auVar114,0xaa);
  fVar211 = auVar38._0_4_;
  auVar233._0_4_ = fVar211 * auVar37._0_4_;
  fVar192 = auVar38._4_4_;
  auVar233._4_4_ = fVar192 * auVar37._4_4_;
  fVar204 = auVar38._8_4_;
  auVar233._8_4_ = fVar204 * auVar37._8_4_;
  fVar206 = auVar38._12_4_;
  auVar233._12_4_ = fVar206 * auVar37._12_4_;
  auVar124._0_4_ = auVar45._0_4_ * fVar211;
  auVar124._4_4_ = auVar45._4_4_ * fVar192;
  auVar124._8_4_ = auVar45._8_4_ * fVar204;
  auVar124._12_4_ = auVar45._12_4_ * fVar206;
  auVar115._0_4_ = auVar40._0_4_ * fVar211;
  auVar115._4_4_ = auVar40._4_4_ * fVar192;
  auVar115._8_4_ = auVar40._8_4_ * fVar204;
  auVar115._12_4_ = auVar40._12_4_ * fVar206;
  auVar36 = vfmadd231ps_fma(auVar233,auVar51,auVar36);
  auVar37 = vfmadd231ps_fma(auVar124,auVar51,auVar44);
  auVar44 = vfmadd231ps_fma(auVar115,auVar51,auVar47);
  auVar45 = vfmadd231ps_fma(auVar36,auVar224,auVar35);
  auVar47 = vfmadd231ps_fma(auVar37,auVar224,auVar46);
  auVar69._16_16_ = in_YmmResult._16_16_;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar35);
  auVar40 = vfmadd231ps_fma(auVar44,auVar224,auVar43);
  auVar36 = vandps_avx512vl(auVar41,auVar35);
  auVar148._8_4_ = 0x219392ef;
  auVar148._0_8_ = 0x219392ef219392ef;
  auVar148._12_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar36,auVar148,1);
  bVar31 = (bool)((byte)uVar34 & 1);
  auVar38._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._0_4_;
  bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._4_4_;
  bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._8_4_;
  bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._12_4_;
  auVar36 = vandps_avx512vl(auVar39,auVar35);
  uVar34 = vcmpps_avx512vl(auVar36,auVar148,1);
  bVar31 = (bool)((byte)uVar34 & 1);
  auVar41._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._0_4_;
  bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._4_4_;
  bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._8_4_;
  bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._12_4_;
  auVar35 = vandps_avx512vl(auVar42,auVar35);
  uVar34 = vcmpps_avx512vl(auVar35,auVar148,1);
  bVar31 = (bool)((byte)uVar34 & 1);
  auVar39._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._0_4_;
  bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._4_4_;
  bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._8_4_;
  bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._12_4_;
  auVar35 = vrcp14ps_avx512vl(auVar38);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar242 = ZEXT1664(auVar36);
  auVar37 = vfnmadd213ps_avx512vl(auVar38,auVar35,auVar36);
  auVar46 = vfmadd132ps_fma(auVar37,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar41);
  auVar37 = vfnmadd213ps_avx512vl(auVar41,auVar35,auVar36);
  auVar44 = vfmadd132ps_fma(auVar37,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar39);
  auVar36 = vfnmadd213ps_avx512vl(auVar39,auVar35,auVar36);
  auVar43 = vfmadd132ps_fma(auVar36,auVar35,auVar35);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar28 * 7 + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar45);
  auVar133._0_4_ = auVar46._0_4_ * auVar35._0_4_;
  auVar133._4_4_ = auVar46._4_4_ * auVar35._4_4_;
  auVar133._8_4_ = auVar46._8_4_ * auVar35._8_4_;
  auVar133._12_4_ = auVar46._12_4_ * auVar35._12_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar28 * 9 + 6);
  auVar35 = vpmovsxwd_avx(auVar36);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar45);
  auVar38 = vpbroadcastd_avx512vl();
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar36 = vpmovsxwd_avx(auVar37);
  auVar102._0_4_ = auVar46._0_4_ * auVar35._0_4_;
  auVar102._4_4_ = auVar46._4_4_ * auVar35._4_4_;
  auVar102._8_4_ = auVar46._8_4_ * auVar35._8_4_;
  auVar102._12_4_ = auVar46._12_4_ * auVar35._12_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar28 * -2 + 6);
  auVar35 = vpmovsxwd_avx(auVar46);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar47);
  auVar149._0_4_ = auVar44._0_4_ * auVar35._0_4_;
  auVar149._4_4_ = auVar44._4_4_ * auVar35._4_4_;
  auVar149._8_4_ = auVar44._8_4_ * auVar35._8_4_;
  auVar149._12_4_ = auVar44._12_4_ * auVar35._12_4_;
  auVar35 = vcvtdq2ps_avx(auVar36);
  auVar35 = vsubps_avx(auVar35,auVar47);
  auVar48._0_4_ = auVar44._0_4_ * auVar35._0_4_;
  auVar48._4_4_ = auVar44._4_4_ * auVar35._4_4_;
  auVar48._8_4_ = auVar44._8_4_ * auVar35._8_4_;
  auVar48._12_4_ = auVar44._12_4_ * auVar35._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar22 + uVar28 + 6);
  auVar35 = vpmovsxwd_avx(auVar44);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar40);
  auVar125._0_4_ = auVar43._0_4_ * auVar35._0_4_;
  auVar125._4_4_ = auVar43._4_4_ * auVar35._4_4_;
  auVar125._8_4_ = auVar43._8_4_ * auVar35._8_4_;
  auVar125._12_4_ = auVar43._12_4_ * auVar35._12_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar28 * 0x17 + 6);
  auVar35 = vpmovsxwd_avx(auVar45);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar40);
  auVar86._0_4_ = auVar43._0_4_ * auVar35._0_4_;
  auVar86._4_4_ = auVar43._4_4_ * auVar35._4_4_;
  auVar86._8_4_ = auVar43._8_4_ * auVar35._8_4_;
  auVar86._12_4_ = auVar43._12_4_ * auVar35._12_4_;
  auVar35 = vpminsd_avx(auVar133,auVar102);
  auVar36 = vpminsd_avx(auVar149,auVar48);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar36 = vpminsd_avx(auVar125,auVar86);
  uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar43._4_4_ = uVar84;
  auVar43._0_4_ = uVar84;
  auVar43._8_4_ = uVar84;
  auVar43._12_4_ = uVar84;
  auVar36 = vmaxps_avx512vl(auVar36,auVar43);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar47._8_4_ = 0x3f7ffffa;
  auVar47._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar47._12_4_ = 0x3f7ffffa;
  local_158 = vmulps_avx512vl(auVar35,auVar47);
  auVar35 = vpmaxsd_avx(auVar133,auVar102);
  auVar36 = vpmaxsd_avx(auVar149,auVar48);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar36 = vpmaxsd_avx(auVar125,auVar86);
  fVar211 = (ray->super_RayK<1>).tfar;
  auVar40._4_4_ = fVar211;
  auVar40._0_4_ = fVar211;
  auVar40._8_4_ = fVar211;
  auVar40._12_4_ = fVar211;
  auVar36 = vminps_avx512vl(auVar36,auVar40);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar51._8_4_ = 0x3f800003;
  auVar51._0_8_ = 0x3f8000033f800003;
  auVar51._12_4_ = 0x3f800003;
  auVar35 = vmulps_avx512vl(auVar35,auVar51);
  uVar10 = vcmpps_avx512vl(local_158,auVar35,2);
  uVar34 = vpcmpgtd_avx512vl(auVar38,_DAT_01f7fcf0);
  uVar34 = ((byte)uVar10 & 0xf) & uVar34;
  if ((char)uVar34 != '\0') {
    auVar69._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar244 = ZEXT1664(auVar69._0_16_);
    do {
      lVar24 = 0;
      for (uVar22 = uVar34; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar27 = *(uint *)(prim + 2);
      pGVar6 = (context->scene->geometries).items[uVar27].ptr;
      local_300 = (ulong)*(uint *)(prim + lVar24 * 4 + 6);
      uVar22 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar24 * 4 + 6));
      p_Var7 = pGVar6[1].intersectionFilterN;
      pvVar8 = pGVar6[2].userPtr;
      _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar35 = *(undefined1 (*) [16])(_Var9 + uVar22 * (long)pvVar8);
      auVar36 = *(undefined1 (*) [16])(_Var9 + (uVar22 + 1) * (long)pvVar8);
      auVar37 = *(undefined1 (*) [16])(_Var9 + (uVar22 + 2) * (long)pvVar8);
      auVar46 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar22 + 3));
      lVar24 = *(long *)&pGVar6[1].time_range.upper;
      auVar44 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * uVar22);
      auVar45 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * (uVar22 + 1));
      auVar43 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * (uVar22 + 2));
      uVar34 = uVar34 - 1 & uVar34;
      auVar47 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * (uVar22 + 3));
      if (uVar34 != 0) {
        uVar28 = uVar34 - 1 & uVar34;
        for (uVar22 = uVar34; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        }
        if (uVar28 != 0) {
          for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar67._16_16_ = auVar69._16_16_;
      auVar85 = auVar244._0_16_;
      auVar38 = vmulps_avx512vl(auVar47,auVar85);
      auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar38);
      auVar87._0_4_ = auVar45._0_4_ + auVar40._0_4_;
      auVar87._4_4_ = auVar45._4_4_ + auVar40._4_4_;
      auVar87._8_4_ = auVar45._8_4_ + auVar40._8_4_;
      auVar87._12_4_ = auVar45._12_4_ + auVar40._12_4_;
      auVar39 = vfmadd231ps_avx512vl(auVar87,auVar44,auVar85);
      auVar67._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      auVar40 = vmulps_avx512vl(auVar47,auVar67._0_16_);
      auVar228._8_4_ = 0x3f000000;
      auVar228._0_8_ = 0x3f0000003f000000;
      auVar228._12_4_ = 0x3f000000;
      auVar40 = vfmadd231ps_fma(auVar40,auVar43,auVar228);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar67._0_16_);
      auVar51 = vfnmadd231ps_fma(auVar40,auVar44,auVar228);
      auVar41 = vmulps_avx512vl(auVar46,auVar85);
      auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar37,auVar41);
      auVar213._0_4_ = auVar40._0_4_ + auVar36._0_4_;
      auVar213._4_4_ = auVar40._4_4_ + auVar36._4_4_;
      auVar213._8_4_ = auVar40._8_4_ + auVar36._8_4_;
      auVar213._12_4_ = auVar40._12_4_ + auVar36._12_4_;
      auVar42 = vfmadd231ps_avx512vl(auVar213,auVar35,auVar85);
      auVar40 = vmulps_avx512vl(auVar46,auVar67._0_16_);
      auVar40 = vfmadd231ps_fma(auVar40,auVar37,auVar228);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar36,auVar67._0_16_);
      auVar40 = vfnmadd231ps_fma(auVar40,auVar35,auVar228);
      auVar103._0_4_ = auVar43._0_4_ + auVar38._0_4_;
      auVar103._4_4_ = auVar43._4_4_ + auVar38._4_4_;
      auVar103._8_4_ = auVar43._8_4_ + auVar38._8_4_;
      auVar103._12_4_ = auVar43._12_4_ + auVar38._12_4_;
      auVar38 = vfmadd231ps_avx512vl(auVar103,auVar45,auVar67._0_16_);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar44,auVar85);
      auVar116._0_4_ = auVar47._0_4_ * 0.5;
      auVar116._4_4_ = auVar47._4_4_ * 0.5;
      auVar116._8_4_ = auVar47._8_4_ * 0.5;
      auVar116._12_4_ = auVar47._12_4_ * 0.5;
      auVar43 = vfmadd231ps_avx512vl(auVar116,auVar67._0_16_,auVar43);
      auVar45 = vfnmadd231ps_fma(auVar43,auVar228,auVar45);
      auVar43 = vfmadd231ps_avx512vl(auVar45,auVar67._0_16_,auVar44);
      auVar167._0_4_ = auVar41._0_4_ + auVar37._0_4_;
      auVar167._4_4_ = auVar41._4_4_ + auVar37._4_4_;
      auVar167._8_4_ = auVar41._8_4_ + auVar37._8_4_;
      auVar167._12_4_ = auVar41._12_4_ + auVar37._12_4_;
      auVar44 = vfmadd231ps_avx512vl(auVar167,auVar36,auVar67._0_16_);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar35,auVar85);
      auVar157._0_4_ = auVar46._0_4_ * 0.5;
      auVar157._4_4_ = auVar46._4_4_ * 0.5;
      auVar157._8_4_ = auVar46._8_4_ * 0.5;
      auVar157._12_4_ = auVar46._12_4_ * 0.5;
      auVar37 = vfmadd231ps_avx512vl(auVar157,auVar67._0_16_,auVar37);
      auVar36 = vfnmadd231ps_fma(auVar37,auVar228,auVar36);
      auVar45 = vfmadd231ps_avx512vl(auVar36,auVar67._0_16_,auVar35);
      auVar35 = vshufps_avx(auVar51,auVar51,0xc9);
      auVar36 = vshufps_avx(auVar42,auVar42,0xc9);
      fVar208 = auVar51._0_4_;
      auVar134._0_4_ = fVar208 * auVar36._0_4_;
      fVar209 = auVar51._4_4_;
      auVar134._4_4_ = fVar209 * auVar36._4_4_;
      fVar210 = auVar51._8_4_;
      auVar134._8_4_ = fVar210 * auVar36._8_4_;
      fVar101 = auVar51._12_4_;
      auVar134._12_4_ = fVar101 * auVar36._12_4_;
      auVar36 = vfmsub231ps_fma(auVar134,auVar35,auVar42);
      auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
      auVar36 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar135._0_4_ = fVar208 * auVar36._0_4_;
      auVar135._4_4_ = fVar209 * auVar36._4_4_;
      auVar135._8_4_ = fVar210 * auVar36._8_4_;
      auVar135._12_4_ = fVar101 * auVar36._12_4_;
      auVar35 = vfmsub231ps_fma(auVar135,auVar35,auVar40);
      auVar46 = vshufps_avx(auVar35,auVar35,0xc9);
      auVar35 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar36 = vshufps_avx(auVar44,auVar44,0xc9);
      fVar113 = auVar43._0_4_;
      auVar126._0_4_ = fVar113 * auVar36._0_4_;
      fVar121 = auVar43._4_4_;
      auVar126._4_4_ = fVar121 * auVar36._4_4_;
      fVar122 = auVar43._8_4_;
      auVar126._8_4_ = fVar122 * auVar36._8_4_;
      fVar123 = auVar43._12_4_;
      auVar126._12_4_ = fVar123 * auVar36._12_4_;
      auVar36 = vfmsub231ps_fma(auVar126,auVar35,auVar44);
      auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
      auVar36 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar168._0_4_ = auVar36._0_4_ * fVar113;
      auVar168._4_4_ = auVar36._4_4_ * fVar121;
      auVar168._8_4_ = auVar36._8_4_ * fVar122;
      auVar168._12_4_ = auVar36._12_4_ * fVar123;
      auVar36 = vfmsub231ps_fma(auVar168,auVar35,auVar45);
      auVar35 = vdpps_avx(auVar37,auVar37,0x7f);
      auVar45 = vshufps_avx(auVar36,auVar36,0xc9);
      fVar192 = auVar35._0_4_;
      auVar52._4_28_ = auVar67._4_28_;
      auVar52._0_4_ = fVar192;
      auVar36 = vrsqrt14ss_avx512f(auVar67._0_16_,auVar52._0_16_);
      fVar211 = auVar36._0_4_;
      auVar36 = vdpps_avx(auVar37,auVar46,0x7f);
      fVar211 = fVar211 * 1.5 + fVar192 * -0.5 * fVar211 * fVar211 * fVar211;
      fVar191 = fVar211 * auVar37._0_4_;
      fVar203 = fVar211 * auVar37._4_4_;
      fVar205 = fVar211 * auVar37._8_4_;
      fVar207 = fVar211 * auVar37._12_4_;
      auVar175._0_4_ = auVar46._0_4_ * fVar192;
      auVar175._4_4_ = auVar46._4_4_ * fVar192;
      auVar175._8_4_ = auVar46._8_4_ * fVar192;
      auVar175._12_4_ = auVar46._12_4_ * fVar192;
      fVar192 = auVar36._0_4_;
      auVar150._0_4_ = fVar192 * auVar37._0_4_;
      auVar150._4_4_ = fVar192 * auVar37._4_4_;
      auVar150._8_4_ = fVar192 * auVar37._8_4_;
      auVar150._12_4_ = fVar192 * auVar37._12_4_;
      auVar37 = vsubps_avx(auVar175,auVar150);
      auVar36 = vrcp14ss_avx512f(auVar67._0_16_,auVar52._0_16_);
      auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
      fVar204 = auVar36._0_4_ * auVar35._0_4_;
      auVar35 = vdpps_avx(auVar44,auVar44,0x7f);
      fVar206 = auVar35._0_4_;
      auVar68._16_16_ = auVar67._16_16_;
      auVar68._0_16_ = auVar67._0_16_;
      auVar53._4_28_ = auVar68._4_28_;
      auVar53._0_4_ = fVar206;
      auVar36 = vrsqrt14ss_avx512f(auVar67._0_16_,auVar53._0_16_);
      fVar192 = auVar36._0_4_;
      fVar192 = fVar192 * 1.5 + fVar206 * -0.5 * fVar192 * fVar192 * fVar192;
      auVar36 = vdpps_avx(auVar44,auVar45,0x7f);
      fVar212 = fVar192 * auVar44._0_4_;
      fVar220 = fVar192 * auVar44._4_4_;
      fVar221 = fVar192 * auVar44._8_4_;
      fVar222 = fVar192 * auVar44._12_4_;
      auVar136._0_4_ = fVar206 * auVar45._0_4_;
      auVar136._4_4_ = fVar206 * auVar45._4_4_;
      auVar136._8_4_ = fVar206 * auVar45._8_4_;
      auVar136._12_4_ = fVar206 * auVar45._12_4_;
      fVar206 = auVar36._0_4_;
      auVar127._0_4_ = fVar206 * auVar44._0_4_;
      auVar127._4_4_ = fVar206 * auVar44._4_4_;
      auVar127._8_4_ = fVar206 * auVar44._8_4_;
      auVar127._12_4_ = fVar206 * auVar44._12_4_;
      auVar46 = vsubps_avx(auVar136,auVar127);
      auVar36 = vrcp14ss_avx512f(auVar67._0_16_,auVar53._0_16_);
      auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
      fVar206 = auVar36._0_4_ * auVar35._0_4_;
      auVar35 = vshufps_avx(auVar39,auVar39,0xff);
      auVar158._0_4_ = fVar191 * auVar35._0_4_;
      auVar158._4_4_ = fVar203 * auVar35._4_4_;
      auVar158._8_4_ = fVar205 * auVar35._8_4_;
      auVar158._12_4_ = fVar207 * auVar35._12_4_;
      local_1f8 = vsubps_avx(auVar39,auVar158);
      auVar36 = vshufps_avx(auVar51,auVar51,0xff);
      auVar137._0_4_ = auVar36._0_4_ * fVar191 + auVar35._0_4_ * fVar211 * auVar37._0_4_ * fVar204;
      auVar137._4_4_ = auVar36._4_4_ * fVar203 + auVar35._4_4_ * fVar211 * auVar37._4_4_ * fVar204;
      auVar137._8_4_ = auVar36._8_4_ * fVar205 + auVar35._8_4_ * fVar211 * auVar37._8_4_ * fVar204;
      auVar137._12_4_ =
           auVar36._12_4_ * fVar207 + auVar35._12_4_ * fVar211 * auVar37._12_4_ * fVar204;
      auVar37 = vsubps_avx(auVar51,auVar137);
      local_208._0_4_ = auVar39._0_4_ + auVar158._0_4_;
      local_208._4_4_ = auVar39._4_4_ + auVar158._4_4_;
      fStack_200 = auVar39._8_4_ + auVar158._8_4_;
      fStack_1fc = auVar39._12_4_ + auVar158._12_4_;
      auVar35 = vshufps_avx(auVar38,auVar38,0xff);
      auVar138._0_4_ = fVar212 * auVar35._0_4_;
      auVar138._4_4_ = fVar220 * auVar35._4_4_;
      auVar138._8_4_ = fVar221 * auVar35._8_4_;
      auVar138._12_4_ = fVar222 * auVar35._12_4_;
      local_218 = vsubps_avx(auVar38,auVar138);
      auVar36 = vshufps_avx(auVar43,auVar43,0xff);
      auVar96._0_4_ = fVar212 * auVar36._0_4_ + auVar35._0_4_ * fVar192 * auVar46._0_4_ * fVar206;
      auVar96._4_4_ = fVar220 * auVar36._4_4_ + auVar35._4_4_ * fVar192 * auVar46._4_4_ * fVar206;
      auVar96._8_4_ = fVar221 * auVar36._8_4_ + auVar35._8_4_ * fVar192 * auVar46._8_4_ * fVar206;
      auVar96._12_4_ =
           fVar222 * auVar36._12_4_ + auVar35._12_4_ * fVar192 * auVar46._12_4_ * fVar206;
      auVar35 = vsubps_avx(auVar43,auVar96);
      _local_228 = vaddps_avx512vl(auVar38,auVar138);
      auVar104._0_4_ = auVar37._0_4_ * 0.33333334;
      auVar104._4_4_ = auVar37._4_4_ * 0.33333334;
      auVar104._8_4_ = auVar37._8_4_ * 0.33333334;
      auVar104._12_4_ = auVar37._12_4_ * 0.33333334;
      local_238 = vaddps_avx512vl(local_1f8,auVar104);
      auVar105._0_4_ = auVar35._0_4_ * 0.33333334;
      auVar105._4_4_ = auVar35._4_4_ * 0.33333334;
      auVar105._8_4_ = auVar35._8_4_ * 0.33333334;
      auVar105._12_4_ = auVar35._12_4_ * 0.33333334;
      local_248 = vsubps_avx512vl(local_218,auVar105);
      auVar88._0_4_ = (fVar208 + auVar137._0_4_) * 0.33333334;
      auVar88._4_4_ = (fVar209 + auVar137._4_4_) * 0.33333334;
      auVar88._8_4_ = (fVar210 + auVar137._8_4_) * 0.33333334;
      auVar88._12_4_ = (fVar101 + auVar137._12_4_) * 0.33333334;
      _local_258 = vaddps_avx512vl(_local_208,auVar88);
      auVar89._0_4_ = (fVar113 + auVar96._0_4_) * 0.33333334;
      auVar89._4_4_ = (fVar121 + auVar96._4_4_) * 0.33333334;
      auVar89._8_4_ = (fVar122 + auVar96._8_4_) * 0.33333334;
      auVar89._12_4_ = (fVar123 + auVar96._12_4_) * 0.33333334;
      aVar1 = (ray->super_RayK<1>).org.field_0;
      _local_268 = vsubps_avx512vl(_local_228,auVar89);
      auVar36 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
      uVar84 = auVar36._0_4_;
      auVar97._4_4_ = uVar84;
      auVar97._0_4_ = uVar84;
      auVar97._8_4_ = uVar84;
      auVar97._12_4_ = uVar84;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      aVar2 = (pre->ray_space).vx.field_0;
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      aVar3 = (pre->ray_space).vy.field_0;
      fVar211 = (pre->ray_space).vz.field_0.m128[0];
      fVar192 = (pre->ray_space).vz.field_0.m128[1];
      fVar204 = (pre->ray_space).vz.field_0.m128[2];
      fVar206 = (pre->ray_space).vz.field_0.m128[3];
      auVar90._0_4_ = fVar211 * auVar36._0_4_;
      auVar90._4_4_ = fVar192 * auVar36._4_4_;
      auVar90._8_4_ = fVar204 * auVar36._8_4_;
      auVar90._12_4_ = fVar206 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar3,auVar35);
      auVar44 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar97);
      auVar36 = vsubps_avx512vl(local_238,(undefined1  [16])aVar1);
      uVar84 = auVar36._0_4_;
      auVar106._4_4_ = uVar84;
      auVar106._0_4_ = uVar84;
      auVar106._8_4_ = uVar84;
      auVar106._12_4_ = uVar84;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar98._0_4_ = fVar211 * auVar36._0_4_;
      auVar98._4_4_ = fVar192 * auVar36._4_4_;
      auVar98._8_4_ = fVar204 * auVar36._8_4_;
      auVar98._12_4_ = fVar206 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar3,auVar35);
      auVar45 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar106);
      auVar36 = vsubps_avx512vl(local_248,(undefined1  [16])aVar1);
      uVar84 = auVar36._0_4_;
      auVar159._4_4_ = uVar84;
      auVar159._0_4_ = uVar84;
      auVar159._8_4_ = uVar84;
      auVar159._12_4_ = uVar84;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar107._0_4_ = fVar211 * auVar36._0_4_;
      auVar107._4_4_ = fVar192 * auVar36._4_4_;
      auVar107._8_4_ = fVar204 * auVar36._8_4_;
      auVar107._12_4_ = fVar206 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar3,auVar35);
      auVar43 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar159);
      auVar36 = vsubps_avx(local_218,(undefined1  [16])aVar1);
      uVar84 = auVar36._0_4_;
      auVar169._4_4_ = uVar84;
      auVar169._0_4_ = uVar84;
      auVar169._8_4_ = uVar84;
      auVar169._12_4_ = uVar84;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar160._0_4_ = fVar211 * auVar36._0_4_;
      auVar160._4_4_ = fVar192 * auVar36._4_4_;
      auVar160._8_4_ = fVar204 * auVar36._8_4_;
      auVar160._12_4_ = fVar206 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar3,auVar35);
      auVar47 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar169);
      auVar36 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
      uVar84 = auVar36._0_4_;
      auVar176._4_4_ = uVar84;
      auVar176._0_4_ = uVar84;
      auVar176._8_4_ = uVar84;
      auVar176._12_4_ = uVar84;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar170._0_4_ = auVar36._0_4_ * fVar211;
      auVar170._4_4_ = auVar36._4_4_ * fVar192;
      auVar170._8_4_ = auVar36._8_4_ * fVar204;
      auVar170._12_4_ = auVar36._12_4_ * fVar206;
      auVar35 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar3,auVar35);
      auVar40 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar176);
      auVar36 = vsubps_avx512vl(_local_258,(undefined1  [16])aVar1);
      uVar84 = auVar36._0_4_;
      auVar186._4_4_ = uVar84;
      auVar186._0_4_ = uVar84;
      auVar186._8_4_ = uVar84;
      auVar186._12_4_ = uVar84;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar177._0_4_ = auVar36._0_4_ * fVar211;
      auVar177._4_4_ = auVar36._4_4_ * fVar192;
      auVar177._8_4_ = auVar36._8_4_ * fVar204;
      auVar177._12_4_ = auVar36._12_4_ * fVar206;
      auVar35 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar3,auVar35);
      auVar51 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar186);
      auVar36 = vsubps_avx512vl(_local_268,(undefined1  [16])aVar1);
      uVar84 = auVar36._0_4_;
      auVar193._4_4_ = uVar84;
      auVar193._0_4_ = uVar84;
      auVar193._8_4_ = uVar84;
      auVar193._12_4_ = uVar84;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar187._0_4_ = auVar36._0_4_ * fVar211;
      auVar187._4_4_ = auVar36._4_4_ * fVar192;
      auVar187._8_4_ = auVar36._8_4_ * fVar204;
      auVar187._12_4_ = auVar36._12_4_ * fVar206;
      auVar35 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar3,auVar35);
      auVar38 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar193);
      auVar36 = vsubps_avx512vl(_local_228,(undefined1  [16])aVar1);
      uVar84 = auVar36._0_4_;
      auVar194._4_4_ = uVar84;
      auVar194._0_4_ = uVar84;
      auVar194._8_4_ = uVar84;
      auVar194._12_4_ = uVar84;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar128._0_4_ = fVar211 * auVar36._0_4_;
      auVar128._4_4_ = fVar192 * auVar36._4_4_;
      auVar128._8_4_ = fVar204 * auVar36._8_4_;
      auVar128._12_4_ = fVar206 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar3,auVar35);
      auVar39 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar194);
      local_1a8 = vmovlhps_avx(auVar44,auVar40);
      local_1b8 = vmovlhps_avx512f(auVar45,auVar51);
      local_1c8 = vmovlhps_avx512f(auVar43,auVar38);
      _local_c8 = vmovlhps_avx512f(auVar47,auVar39);
      auVar35 = vminps_avx512vl(local_1a8,local_1b8);
      auVar37 = vmaxps_avx512vl(local_1a8,local_1b8);
      auVar36 = vminps_avx512vl(local_1c8,_local_c8);
      auVar36 = vminps_avx(auVar35,auVar36);
      auVar35 = vmaxps_avx512vl(local_1c8,_local_c8);
      auVar35 = vmaxps_avx(auVar37,auVar35);
      auVar37 = vshufpd_avx(auVar36,auVar36,3);
      auVar46 = vshufpd_avx(auVar35,auVar35,3);
      auVar36 = vminps_avx(auVar36,auVar37);
      auVar35 = vmaxps_avx(auVar35,auVar46);
      auVar36 = vandps_avx512vl(auVar36,auVar241._0_16_);
      auVar35 = vandps_avx512vl(auVar35,auVar241._0_16_);
      auVar35 = vmaxps_avx(auVar36,auVar35);
      auVar36 = vmovshdup_avx(auVar35);
      auVar35 = vmaxss_avx(auVar36,auVar35);
      fVar211 = auVar35._0_4_ * 9.536743e-07;
      local_1d8 = vmovddup_avx512vl(auVar44);
      auVar243 = ZEXT1664(local_1d8);
      local_1e8 = vmovddup_avx512vl(auVar45);
      auVar245 = ZEXT1664(local_1e8);
      local_2a8._8_8_ = auVar43._0_8_;
      local_2a8._0_8_ = auVar43._0_8_;
      local_2b8._0_8_ = auVar47._0_8_;
      local_2b8._8_8_ = local_2b8._0_8_;
      register0x00001348 = auVar40._0_8_;
      local_2c8 = auVar40._0_8_;
      register0x00001388 = auVar51._0_8_;
      local_2d8 = auVar51._0_8_;
      register0x00001408 = auVar38._0_8_;
      local_2e8 = auVar38._0_8_;
      register0x00001448 = auVar39._0_8_;
      local_2f8 = auVar39._0_8_;
      local_d8 = ZEXT416((uint)fVar211);
      auVar91._4_4_ = fVar211;
      auVar91._0_4_ = fVar211;
      auVar91._8_4_ = fVar211;
      auVar91._12_4_ = fVar211;
      local_78._16_4_ = fVar211;
      local_78._0_16_ = auVar91;
      local_78._20_4_ = fVar211;
      local_78._24_4_ = fVar211;
      local_78._28_4_ = fVar211;
      auVar35 = vxorps_avx512vl(auVar91,auVar85);
      local_98 = auVar35._0_4_;
      uStack_94 = local_98;
      uStack_90 = local_98;
      uStack_8c = local_98;
      uStack_88 = local_98;
      uStack_84 = local_98;
      uStack_80 = local_98;
      uStack_7c = local_98;
      local_e8 = vsubps_avx512vl(local_1b8,local_1a8);
      local_f8 = vsubps_avx512vl(local_1c8,local_1b8);
      local_108 = vsubps_avx512vl(_local_c8,local_1c8);
      local_118 = vsubps_avx(_local_208,local_1f8);
      local_128 = vsubps_avx512vl(_local_258,local_238);
      local_138 = vsubps_avx512vl(_local_268,local_248);
      _local_148 = vsubps_avx512vl(_local_228,local_218);
      uVar22 = 0;
      auVar35 = ZEXT816(0x3f80000000000000);
      auVar99 = auVar35;
LAB_01adcee3:
      auVar36 = vshufps_avx(auVar99,auVar99,0x50);
      auVar229._8_4_ = 0x3f800000;
      auVar229._0_8_ = 0x3f8000003f800000;
      auVar229._12_4_ = 0x3f800000;
      auVar232._16_4_ = 0x3f800000;
      auVar232._0_16_ = auVar229;
      auVar232._20_4_ = 0x3f800000;
      auVar232._24_4_ = 0x3f800000;
      auVar232._28_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar229,auVar36);
      fVar211 = auVar36._0_4_;
      auVar129._0_4_ = local_2c8._0_4_ * fVar211;
      fVar192 = auVar36._4_4_;
      auVar129._4_4_ = local_2c8._4_4_ * fVar192;
      fVar204 = auVar36._8_4_;
      auVar129._8_4_ = local_2c8._8_4_ * fVar204;
      fVar206 = auVar36._12_4_;
      auVar129._12_4_ = local_2c8._12_4_ * fVar206;
      auVar139._0_4_ = local_2d8._0_4_ * fVar211;
      auVar139._4_4_ = local_2d8._4_4_ * fVar192;
      auVar139._8_4_ = local_2d8._8_4_ * fVar204;
      auVar139._12_4_ = local_2d8._12_4_ * fVar206;
      auVar151._0_4_ = local_2e8._0_4_ * fVar211;
      auVar151._4_4_ = local_2e8._4_4_ * fVar192;
      auVar151._8_4_ = local_2e8._8_4_ * fVar204;
      auVar151._12_4_ = local_2e8._12_4_ * fVar206;
      auVar108._0_4_ = local_2f8._0_4_ * fVar211;
      auVar108._4_4_ = local_2f8._4_4_ * fVar192;
      auVar108._8_4_ = local_2f8._8_4_ * fVar204;
      auVar108._12_4_ = local_2f8._12_4_ * fVar206;
      auVar44 = vfmadd231ps_avx512vl(auVar129,auVar37,auVar243._0_16_);
      auVar45 = vfmadd231ps_avx512vl(auVar139,auVar37,auVar245._0_16_);
      auVar46 = vfmadd231ps_fma(auVar151,auVar37,local_2a8);
      auVar37 = vfmadd231ps_fma(auVar108,local_2b8,auVar37);
      auVar36 = vmovshdup_avx(auVar35);
      fVar192 = auVar35._0_4_;
      fVar211 = (auVar36._0_4_ - fVar192) * 0.04761905;
      auVar66._4_4_ = fVar192;
      auVar66._0_4_ = fVar192;
      auVar66._8_4_ = fVar192;
      auVar66._12_4_ = fVar192;
      auVar66._16_4_ = fVar192;
      auVar66._20_4_ = fVar192;
      auVar66._24_4_ = fVar192;
      auVar66._28_4_ = fVar192;
      auVar61._0_8_ = auVar36._0_8_;
      auVar61._8_8_ = auVar61._0_8_;
      auVar61._16_8_ = auVar61._0_8_;
      auVar61._24_8_ = auVar61._0_8_;
      auVar69 = vsubps_avx(auVar61,auVar66);
      uVar84 = auVar44._0_4_;
      auVar71._4_4_ = uVar84;
      auVar71._0_4_ = uVar84;
      auVar71._8_4_ = uVar84;
      auVar71._12_4_ = uVar84;
      auVar71._16_4_ = uVar84;
      auVar71._20_4_ = uVar84;
      auVar71._24_4_ = uVar84;
      auVar71._28_4_ = uVar84;
      auVar132._8_4_ = 1;
      auVar132._0_8_ = 0x100000001;
      auVar132._12_4_ = 1;
      auVar132._16_4_ = 1;
      auVar132._20_4_ = 1;
      auVar132._24_4_ = 1;
      auVar132._28_4_ = 1;
      auVar68 = ZEXT1632(auVar44);
      auVar67 = vpermps_avx2(auVar132,auVar68);
      auVar52 = vbroadcastss_avx512vl(auVar45);
      auVar62 = ZEXT1632(auVar45);
      auVar53 = vpermps_avx512vl(auVar132,auVar62);
      auVar54 = vbroadcastss_avx512vl(auVar46);
      auVar63 = ZEXT1632(auVar46);
      auVar55 = vpermps_avx512vl(auVar132,auVar63);
      auVar56 = vbroadcastss_avx512vl(auVar37);
      auVar65 = ZEXT1632(auVar37);
      auVar57 = vpermps_avx512vl(auVar132,auVar65);
      auVar146._4_4_ = fVar211;
      auVar146._0_4_ = fVar211;
      auVar146._8_4_ = fVar211;
      auVar146._12_4_ = fVar211;
      auVar146._16_4_ = fVar211;
      auVar146._20_4_ = fVar211;
      auVar146._24_4_ = fVar211;
      auVar146._28_4_ = fVar211;
      auVar64._8_4_ = 2;
      auVar64._0_8_ = 0x200000002;
      auVar64._12_4_ = 2;
      auVar64._16_4_ = 2;
      auVar64._20_4_ = 2;
      auVar64._24_4_ = 2;
      auVar64._28_4_ = 2;
      auVar58 = vpermps_avx512vl(auVar64,auVar68);
      auVar59 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar60 = vpermps_avx512vl(auVar59,auVar68);
      auVar61 = vpermps_avx512vl(auVar64,auVar62);
      auVar62 = vpermps_avx512vl(auVar59,auVar62);
      auVar68 = vpermps_avx2(auVar64,auVar63);
      auVar63 = vpermps_avx512vl(auVar59,auVar63);
      auVar64 = vpermps_avx512vl(auVar64,auVar65);
      auVar65 = vpermps_avx512vl(auVar59,auVar65);
      auVar36 = vfmadd132ps_fma(auVar69,auVar66,_DAT_01faff20);
      auVar69 = vsubps_avx(auVar232,ZEXT1632(auVar36));
      auVar59 = vmulps_avx512vl(auVar52,ZEXT1632(auVar36));
      auVar70 = ZEXT1632(auVar36);
      auVar66 = vmulps_avx512vl(auVar53,auVar70);
      auVar37 = vfmadd231ps_fma(auVar59,auVar69,auVar71);
      auVar46 = vfmadd231ps_fma(auVar66,auVar69,auVar67);
      auVar59 = vmulps_avx512vl(auVar54,auVar70);
      auVar66 = vmulps_avx512vl(auVar55,auVar70);
      auVar52 = vfmadd231ps_avx512vl(auVar59,auVar69,auVar52);
      auVar53 = vfmadd231ps_avx512vl(auVar66,auVar69,auVar53);
      auVar59 = vmulps_avx512vl(auVar56,auVar70);
      auVar71 = ZEXT1632(auVar36);
      auVar57 = vmulps_avx512vl(auVar57,auVar71);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar69,auVar54);
      auVar66 = vfmadd231ps_avx512vl(auVar57,auVar69,auVar55);
      fVar204 = auVar36._0_4_;
      fVar206 = auVar36._4_4_;
      auVar54._4_4_ = fVar206 * auVar52._4_4_;
      auVar54._0_4_ = fVar204 * auVar52._0_4_;
      fVar208 = auVar36._8_4_;
      auVar54._8_4_ = fVar208 * auVar52._8_4_;
      fVar209 = auVar36._12_4_;
      auVar54._12_4_ = fVar209 * auVar52._12_4_;
      auVar54._16_4_ = auVar52._16_4_ * 0.0;
      auVar54._20_4_ = auVar52._20_4_ * 0.0;
      auVar54._24_4_ = auVar52._24_4_ * 0.0;
      auVar54._28_4_ = fVar192;
      auVar55._4_4_ = fVar206 * auVar53._4_4_;
      auVar55._0_4_ = fVar204 * auVar53._0_4_;
      auVar55._8_4_ = fVar208 * auVar53._8_4_;
      auVar55._12_4_ = fVar209 * auVar53._12_4_;
      auVar55._16_4_ = auVar53._16_4_ * 0.0;
      auVar55._20_4_ = auVar53._20_4_ * 0.0;
      auVar55._24_4_ = auVar53._24_4_ * 0.0;
      auVar55._28_4_ = auVar67._28_4_;
      auVar37 = vfmadd231ps_fma(auVar54,auVar69,ZEXT1632(auVar37));
      auVar46 = vfmadd231ps_fma(auVar55,auVar69,ZEXT1632(auVar46));
      auVar70._0_4_ = fVar204 * auVar59._0_4_;
      auVar70._4_4_ = fVar206 * auVar59._4_4_;
      auVar70._8_4_ = fVar208 * auVar59._8_4_;
      auVar70._12_4_ = fVar209 * auVar59._12_4_;
      auVar70._16_4_ = auVar59._16_4_ * 0.0;
      auVar70._20_4_ = auVar59._20_4_ * 0.0;
      auVar70._24_4_ = auVar59._24_4_ * 0.0;
      auVar70._28_4_ = 0;
      auVar57._4_4_ = fVar206 * auVar66._4_4_;
      auVar57._0_4_ = fVar204 * auVar66._0_4_;
      auVar57._8_4_ = fVar208 * auVar66._8_4_;
      auVar57._12_4_ = fVar209 * auVar66._12_4_;
      auVar57._16_4_ = auVar66._16_4_ * 0.0;
      auVar57._20_4_ = auVar66._20_4_ * 0.0;
      auVar57._24_4_ = auVar66._24_4_ * 0.0;
      auVar57._28_4_ = auVar59._28_4_;
      auVar44 = vfmadd231ps_fma(auVar70,auVar69,auVar52);
      auVar45 = vfmadd231ps_fma(auVar57,auVar69,auVar53);
      auVar59._28_4_ = auVar53._28_4_;
      auVar59._0_28_ =
           ZEXT1628(CONCAT412(fVar209 * auVar45._12_4_,
                              CONCAT48(fVar208 * auVar45._8_4_,
                                       CONCAT44(fVar206 * auVar45._4_4_,fVar204 * auVar45._0_4_))));
      auVar43 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar209 * auVar44._12_4_,
                                                   CONCAT48(fVar208 * auVar44._8_4_,
                                                            CONCAT44(fVar206 * auVar44._4_4_,
                                                                     fVar204 * auVar44._0_4_)))),
                                auVar69,ZEXT1632(auVar37));
      auVar47 = vfmadd231ps_fma(auVar59,auVar69,ZEXT1632(auVar46));
      auVar67 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar37));
      auVar52 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar46));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar67 = vmulps_avx512vl(auVar67,auVar53);
      auVar52 = vmulps_avx512vl(auVar52,auVar53);
      auVar72._0_4_ = fVar211 * auVar67._0_4_;
      auVar72._4_4_ = fVar211 * auVar67._4_4_;
      auVar72._8_4_ = fVar211 * auVar67._8_4_;
      auVar72._12_4_ = fVar211 * auVar67._12_4_;
      auVar72._16_4_ = fVar211 * auVar67._16_4_;
      auVar72._20_4_ = fVar211 * auVar67._20_4_;
      auVar72._24_4_ = fVar211 * auVar67._24_4_;
      auVar72._28_4_ = 0;
      auVar67 = vmulps_avx512vl(auVar146,auVar52);
      auVar46 = vxorps_avx512vl(auVar56._0_16_,auVar56._0_16_);
      auVar52 = vpermt2ps_avx512vl(ZEXT1632(auVar43),_DAT_01feed00,ZEXT1632(auVar46));
      auVar54 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_01feed00,ZEXT1632(auVar46));
      auVar112._0_4_ = auVar72._0_4_ + auVar43._0_4_;
      auVar112._4_4_ = auVar72._4_4_ + auVar43._4_4_;
      auVar112._8_4_ = auVar72._8_4_ + auVar43._8_4_;
      auVar112._12_4_ = auVar72._12_4_ + auVar43._12_4_;
      auVar112._16_4_ = auVar72._16_4_ + 0.0;
      auVar112._20_4_ = auVar72._20_4_ + 0.0;
      auVar112._24_4_ = auVar72._24_4_ + 0.0;
      auVar112._28_4_ = 0;
      auVar66 = ZEXT1632(auVar46);
      auVar55 = vpermt2ps_avx512vl(auVar72,_DAT_01feed00,auVar66);
      auVar57 = vaddps_avx512vl(ZEXT1632(auVar47),auVar67);
      auVar59 = vpermt2ps_avx512vl(auVar67,_DAT_01feed00,auVar66);
      auVar67 = vsubps_avx(auVar52,auVar55);
      auVar55 = vsubps_avx512vl(auVar54,auVar59);
      auVar59 = vmulps_avx512vl(auVar61,auVar71);
      auVar56 = vmulps_avx512vl(auVar62,auVar71);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar69,auVar58);
      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar69,auVar60);
      auVar58 = vmulps_avx512vl(auVar68,auVar71);
      auVar60 = vmulps_avx512vl(auVar63,auVar71);
      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar69,auVar61);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar69,auVar62);
      auVar61 = vmulps_avx512vl(auVar64,auVar71);
      auVar62 = vmulps_avx512vl(auVar65,auVar71);
      auVar37 = vfmadd231ps_fma(auVar61,auVar69,auVar68);
      auVar68 = vfmadd231ps_avx512vl(auVar62,auVar69,auVar63);
      auVar61 = vmulps_avx512vl(auVar71,auVar58);
      auVar64 = ZEXT1632(auVar36);
      auVar62 = vmulps_avx512vl(auVar64,auVar60);
      auVar59 = vfmadd231ps_avx512vl(auVar61,auVar69,auVar59);
      auVar61 = vfmadd231ps_avx512vl(auVar62,auVar69,auVar56);
      auVar68 = vmulps_avx512vl(auVar64,auVar68);
      auVar58 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar209 * auVar37._12_4_,
                                              CONCAT48(fVar208 * auVar37._8_4_,
                                                       CONCAT44(fVar206 * auVar37._4_4_,
                                                                fVar204 * auVar37._0_4_)))),auVar69,
                           auVar58);
      auVar68 = vfmadd231ps_avx512vl(auVar68,auVar69,auVar60);
      auVar56._4_4_ = fVar206 * auVar58._4_4_;
      auVar56._0_4_ = fVar204 * auVar58._0_4_;
      auVar56._8_4_ = fVar208 * auVar58._8_4_;
      auVar56._12_4_ = fVar209 * auVar58._12_4_;
      auVar56._16_4_ = auVar58._16_4_ * 0.0;
      auVar56._20_4_ = auVar58._20_4_ * 0.0;
      auVar56._24_4_ = auVar58._24_4_ * 0.0;
      auVar56._28_4_ = auVar63._28_4_;
      auVar60 = vmulps_avx512vl(auVar64,auVar68);
      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar69,auVar59);
      auVar62 = vfmadd231ps_avx512vl(auVar60,auVar61,auVar69);
      auVar69 = vsubps_avx512vl(auVar58,auVar59);
      auVar68 = vsubps_avx512vl(auVar68,auVar61);
      auVar69 = vmulps_avx512vl(auVar69,auVar53);
      auVar68 = vmulps_avx512vl(auVar68,auVar53);
      fVar192 = fVar211 * auVar69._0_4_;
      fVar204 = fVar211 * auVar69._4_4_;
      auVar58._4_4_ = fVar204;
      auVar58._0_4_ = fVar192;
      fVar206 = fVar211 * auVar69._8_4_;
      auVar58._8_4_ = fVar206;
      fVar208 = fVar211 * auVar69._12_4_;
      auVar58._12_4_ = fVar208;
      fVar209 = fVar211 * auVar69._16_4_;
      auVar58._16_4_ = fVar209;
      fVar210 = fVar211 * auVar69._20_4_;
      auVar58._20_4_ = fVar210;
      fVar211 = fVar211 * auVar69._24_4_;
      auVar58._24_4_ = fVar211;
      auVar58._28_4_ = auVar69._28_4_;
      auVar68 = vmulps_avx512vl(auVar146,auVar68);
      auVar53 = vpermt2ps_avx512vl(auVar56,_DAT_01feed00,auVar66);
      auVar59 = vpermt2ps_avx512vl(auVar62,_DAT_01feed00,auVar66);
      auVar190._0_4_ = auVar56._0_4_ + fVar192;
      auVar190._4_4_ = auVar56._4_4_ + fVar204;
      auVar190._8_4_ = auVar56._8_4_ + fVar206;
      auVar190._12_4_ = auVar56._12_4_ + fVar208;
      auVar190._16_4_ = auVar56._16_4_ + fVar209;
      auVar190._20_4_ = auVar56._20_4_ + fVar210;
      auVar190._24_4_ = auVar56._24_4_ + fVar211;
      auVar190._28_4_ = auVar56._28_4_ + auVar69._28_4_;
      auVar69 = vpermt2ps_avx512vl(auVar58,_DAT_01feed00,ZEXT1632(auVar46));
      auVar58 = vaddps_avx512vl(auVar62,auVar68);
      auVar68 = vpermt2ps_avx512vl(auVar68,_DAT_01feed00,ZEXT1632(auVar46));
      auVar69 = vsubps_avx(auVar53,auVar69);
      auVar68 = vsubps_avx512vl(auVar59,auVar68);
      in_ZMM17 = ZEXT3264(auVar68);
      auVar132 = ZEXT1632(auVar43);
      auVar60 = vsubps_avx512vl(auVar56,auVar132);
      auVar146 = ZEXT1632(auVar47);
      auVar61 = vsubps_avx512vl(auVar62,auVar146);
      auVar63 = vsubps_avx512vl(auVar53,auVar52);
      auVar60 = vaddps_avx512vl(auVar60,auVar63);
      auVar63 = vsubps_avx512vl(auVar59,auVar54);
      auVar61 = vaddps_avx512vl(auVar61,auVar63);
      auVar63 = vmulps_avx512vl(auVar146,auVar60);
      auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar132,auVar61);
      auVar64 = vmulps_avx512vl(auVar57,auVar60);
      auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar112,auVar61);
      auVar65 = vmulps_avx512vl(auVar55,auVar60);
      auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar67,auVar61);
      auVar66 = vmulps_avx512vl(auVar54,auVar60);
      auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar52,auVar61);
      auVar70 = vmulps_avx512vl(auVar62,auVar60);
      auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar56,auVar61);
      auVar71 = vmulps_avx512vl(auVar58,auVar60);
      auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar190,auVar61);
      auVar72 = vmulps_avx512vl(auVar68,auVar60);
      auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar69,auVar61);
      auVar60 = vmulps_avx512vl(auVar59,auVar60);
      auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar53,auVar61);
      auVar61 = vminps_avx512vl(auVar63,auVar64);
      auVar63 = vmaxps_avx512vl(auVar63,auVar64);
      auVar64 = vminps_avx512vl(auVar65,auVar66);
      auVar61 = vminps_avx512vl(auVar61,auVar64);
      auVar64 = vmaxps_avx512vl(auVar65,auVar66);
      auVar63 = vmaxps_avx512vl(auVar63,auVar64);
      auVar64 = vminps_avx512vl(auVar70,auVar71);
      auVar65 = vmaxps_avx512vl(auVar70,auVar71);
      auVar66 = vminps_avx512vl(auVar72,auVar60);
      auVar64 = vminps_avx512vl(auVar64,auVar66);
      auVar61 = vminps_avx512vl(auVar61,auVar64);
      auVar60 = vmaxps_avx512vl(auVar72,auVar60);
      auVar60 = vmaxps_avx512vl(auVar65,auVar60);
      auVar63 = vmaxps_avx512vl(auVar63,auVar60);
      uVar10 = vcmpps_avx512vl(auVar61,local_78,2);
      auVar60._4_4_ = uStack_94;
      auVar60._0_4_ = local_98;
      auVar60._8_4_ = uStack_90;
      auVar60._12_4_ = uStack_8c;
      auVar60._16_4_ = uStack_88;
      auVar60._20_4_ = uStack_84;
      auVar60._24_4_ = uStack_80;
      auVar60._28_4_ = uStack_7c;
      uVar11 = vcmpps_avx512vl(auVar63,auVar60,5);
      bVar20 = (byte)uVar10 & (byte)uVar11 & 0x7f;
      if (bVar20 != 0) {
        auVar61 = vsubps_avx512vl(auVar52,auVar132);
        auVar63 = vsubps_avx512vl(auVar54,auVar146);
        auVar64 = vsubps_avx512vl(auVar53,auVar56);
        auVar61 = vaddps_avx512vl(auVar61,auVar64);
        auVar64 = vsubps_avx512vl(auVar59,auVar62);
        auVar63 = vaddps_avx512vl(auVar63,auVar64);
        auVar64 = vmulps_avx512vl(auVar146,auVar61);
        auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar63,auVar132);
        auVar57 = vmulps_avx512vl(auVar57,auVar61);
        auVar57 = vfnmadd213ps_avx512vl(auVar112,auVar63,auVar57);
        auVar55 = vmulps_avx512vl(auVar55,auVar61);
        auVar55 = vfnmadd213ps_avx512vl(auVar67,auVar63,auVar55);
        auVar67 = vmulps_avx512vl(auVar54,auVar61);
        auVar54 = vfnmadd231ps_avx512vl(auVar67,auVar63,auVar52);
        auVar67 = vmulps_avx512vl(auVar62,auVar61);
        auVar56 = vfnmadd231ps_avx512vl(auVar67,auVar63,auVar56);
        auVar67 = vmulps_avx512vl(auVar58,auVar61);
        auVar58 = vfnmadd213ps_avx512vl(auVar190,auVar63,auVar67);
        auVar67 = vmulps_avx512vl(auVar68,auVar61);
        auVar62 = vfnmadd213ps_avx512vl(auVar69,auVar63,auVar67);
        auVar69 = vmulps_avx512vl(auVar59,auVar61);
        auVar59 = vfnmadd231ps_avx512vl(auVar69,auVar53,auVar63);
        auVar67 = vminps_avx(auVar64,auVar57);
        auVar69 = vmaxps_avx(auVar64,auVar57);
        auVar52 = vminps_avx(auVar55,auVar54);
        auVar52 = vminps_avx(auVar67,auVar52);
        auVar67 = vmaxps_avx(auVar55,auVar54);
        auVar69 = vmaxps_avx(auVar69,auVar67);
        auVar68 = vminps_avx(auVar56,auVar58);
        auVar67 = vmaxps_avx(auVar56,auVar58);
        auVar53 = vminps_avx(auVar62,auVar59);
        auVar68 = vminps_avx(auVar68,auVar53);
        auVar68 = vminps_avx(auVar52,auVar68);
        auVar52 = vmaxps_avx(auVar62,auVar59);
        auVar67 = vmaxps_avx(auVar67,auVar52);
        auVar69 = vmaxps_avx(auVar69,auVar67);
        uVar10 = vcmpps_avx512vl(auVar69,auVar60,5);
        uVar11 = vcmpps_avx512vl(auVar68,local_78,2);
        bVar20 = bVar20 & (byte)uVar10 & (byte)uVar11;
        if (bVar20 != 0) {
          auStack_198[uVar22] = (uint)bVar20;
          uVar10 = vmovlps_avx(auVar35);
          (&uStack_b8)[uVar22] = uVar10;
          uVar28 = vmovlps_avx(auVar99);
          auStack_58[uVar22] = uVar28;
          uVar22 = (ulong)((int)uVar22 + 1);
        }
      }
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar238 = ZEXT3264(auVar69);
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar239 = ZEXT1664(auVar35);
      auVar240 = ZEXT3264(_DAT_01feed20);
      auVar69 = _DAT_01feed20;
      if ((int)uVar22 != 0) {
        do {
          auVar37 = auVar242._0_16_;
          auVar36 = SUB6416(ZEXT464(0xb8d1b717),0);
          auVar44 = auVar245._0_16_;
          auVar46 = auVar243._0_16_;
          uVar21 = (int)uVar22 - 1;
          uVar23 = (ulong)uVar21;
          uVar5 = auStack_198[uVar23];
          auVar99._8_8_ = 0;
          auVar99._0_8_ = auStack_58[uVar23];
          uVar28 = 0;
          for (uVar26 = (ulong)uVar5; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
          {
            uVar28 = uVar28 + 1;
          }
          uVar25 = uVar5 - 1 & uVar5;
          bVar31 = uVar25 == 0;
          auStack_198[uVar23] = uVar25;
          if (bVar31) {
            uVar22 = (ulong)uVar21;
          }
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar28;
          auVar35 = vpunpcklqdq_avx(auVar92,ZEXT416((int)uVar28 + 1));
          auVar35 = vcvtqq2ps_avx512vl(auVar35);
          auVar35 = vmulps_avx512vl(auVar35,auVar239._0_16_);
          uVar84 = *(undefined4 *)((long)&uStack_b8 + uVar23 * 8 + 4);
          auVar12._4_4_ = uVar84;
          auVar12._0_4_ = uVar84;
          auVar12._8_4_ = uVar84;
          auVar12._12_4_ = uVar84;
          auVar45 = vmulps_avx512vl(auVar35,auVar12);
          auVar35 = vsubps_avx512vl(auVar37,auVar35);
          uVar84 = *(undefined4 *)(&uStack_b8 + uVar23);
          auVar13._4_4_ = uVar84;
          auVar13._0_4_ = uVar84;
          auVar13._8_4_ = uVar84;
          auVar13._12_4_ = uVar84;
          auVar35 = vfmadd231ps_avx512vl(auVar45,auVar35,auVar13);
          auVar45 = vmovshdup_avx(auVar35);
          fVar211 = auVar45._0_4_ - auVar35._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar211));
          if (uVar5 == 0 || bVar31) goto LAB_01adcee3;
          auVar45 = vshufps_avx(auVar99,auVar99,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar211));
          uVar21 = (uint)uVar22;
          bVar29 = uVar21 < 4;
          bVar32 = uVar21 - 4 == 0;
          bVar30 = (POPCOUNT(uVar21 - 4 & 0xff) & 1U) == 0;
          auVar43 = vsubps_avx512vl(auVar37,auVar45);
          fVar192 = auVar45._0_4_;
          auVar140._0_4_ = fVar192 * (float)local_2c8._0_4_;
          fVar204 = auVar45._4_4_;
          auVar140._4_4_ = fVar204 * (float)local_2c8._4_4_;
          fVar206 = auVar45._8_4_;
          auVar140._8_4_ = fVar206 * fStack_2c0;
          fVar208 = auVar45._12_4_;
          auVar140._12_4_ = fVar208 * fStack_2bc;
          auVar152._0_4_ = fVar192 * (float)local_2d8._0_4_;
          auVar152._4_4_ = fVar204 * (float)local_2d8._4_4_;
          auVar152._8_4_ = fVar206 * fStack_2d0;
          auVar152._12_4_ = fVar208 * fStack_2cc;
          auVar161._0_4_ = fVar192 * (float)local_2e8._0_4_;
          auVar161._4_4_ = fVar204 * (float)local_2e8._4_4_;
          auVar161._8_4_ = fVar206 * fStack_2e0;
          auVar161._12_4_ = fVar208 * fStack_2dc;
          auVar117._0_4_ = fVar192 * (float)local_2f8._0_4_;
          auVar117._4_4_ = fVar204 * (float)local_2f8._4_4_;
          auVar117._8_4_ = fVar206 * fStack_2f0;
          auVar117._12_4_ = fVar208 * fStack_2ec;
          auVar47 = vfmadd231ps_avx512vl(auVar140,auVar43,auVar46);
          auVar40 = vfmadd231ps_avx512vl(auVar152,auVar43,auVar44);
          auVar45 = vfmadd231ps_fma(auVar161,auVar43,local_2a8);
          auVar43 = vfmadd231ps_fma(auVar117,auVar43,local_2b8);
          auVar63._16_16_ = auVar47;
          auVar63._0_16_ = auVar47;
          auVar65._16_16_ = auVar40;
          auVar65._0_16_ = auVar40;
          auVar156._16_16_ = auVar45;
          auVar156._0_16_ = auVar45;
          auVar67 = vpermps_avx512vl(auVar240._0_32_,ZEXT1632(auVar35));
          auVar69 = vsubps_avx(auVar65,auVar63);
          auVar47 = vfmadd213ps_fma(auVar69,auVar67,auVar63);
          auVar69 = vsubps_avx(auVar156,auVar65);
          auVar40 = vfmadd213ps_fma(auVar69,auVar67,auVar65);
          auVar45 = vsubps_avx(auVar43,auVar45);
          auVar147._16_16_ = auVar45;
          auVar147._0_16_ = auVar45;
          auVar45 = vfmadd213ps_fma(auVar147,auVar67,auVar156);
          auVar69 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar47));
          auVar43 = vfmadd213ps_fma(auVar69,auVar67,ZEXT1632(auVar47));
          auVar69 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar40));
          auVar45 = vfmadd213ps_fma(auVar69,auVar67,ZEXT1632(auVar40));
          auVar69 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar43));
          auVar50 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar69,auVar67);
          auVar69 = vmulps_avx512vl(auVar69,auVar238._0_32_);
          auVar62._16_16_ = auVar69._16_16_;
          auVar45 = vmulss_avx512f(ZEXT416((uint)fVar211),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar192 = auVar45._0_4_;
          auVar162._0_8_ =
               CONCAT44(auVar50._4_4_ + fVar192 * auVar69._4_4_,
                        auVar50._0_4_ + fVar192 * auVar69._0_4_);
          auVar162._8_4_ = auVar50._8_4_ + fVar192 * auVar69._8_4_;
          auVar162._12_4_ = auVar50._12_4_ + fVar192 * auVar69._12_4_;
          auVar141._0_4_ = fVar192 * auVar69._16_4_;
          auVar141._4_4_ = fVar192 * auVar69._20_4_;
          auVar141._8_4_ = fVar192 * auVar69._24_4_;
          auVar141._12_4_ = fVar192 * auVar69._28_4_;
          auVar42 = vsubps_avx((undefined1  [16])0x0,auVar141);
          auVar51 = vshufpd_avx(auVar50,auVar50,3);
          auVar38 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar45 = vsubps_avx(auVar51,auVar50);
          auVar43 = vsubps_avx(auVar38,(undefined1  [16])0x0);
          auVar178._0_4_ = auVar45._0_4_ + auVar43._0_4_;
          auVar178._4_4_ = auVar45._4_4_ + auVar43._4_4_;
          auVar178._8_4_ = auVar45._8_4_ + auVar43._8_4_;
          auVar178._12_4_ = auVar45._12_4_ + auVar43._12_4_;
          auVar45 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar43 = vshufps_avx(auVar162,auVar162,0xb1);
          auVar47 = vshufps_avx(auVar42,auVar42,0xb1);
          auVar40 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar230._4_4_ = auVar178._0_4_;
          auVar230._0_4_ = auVar178._0_4_;
          auVar230._8_4_ = auVar178._0_4_;
          auVar230._12_4_ = auVar178._0_4_;
          auVar39 = vshufps_avx(auVar178,auVar178,0x55);
          fVar192 = auVar39._0_4_;
          auVar188._0_4_ = auVar45._0_4_ * fVar192;
          fVar204 = auVar39._4_4_;
          auVar188._4_4_ = auVar45._4_4_ * fVar204;
          fVar206 = auVar39._8_4_;
          auVar188._8_4_ = auVar45._8_4_ * fVar206;
          fVar208 = auVar39._12_4_;
          auVar188._12_4_ = auVar45._12_4_ * fVar208;
          auVar195._0_4_ = auVar43._0_4_ * fVar192;
          auVar195._4_4_ = auVar43._4_4_ * fVar204;
          auVar195._8_4_ = auVar43._8_4_ * fVar206;
          auVar195._12_4_ = auVar43._12_4_ * fVar208;
          auVar214._0_4_ = auVar47._0_4_ * fVar192;
          auVar214._4_4_ = auVar47._4_4_ * fVar204;
          auVar214._8_4_ = auVar47._8_4_ * fVar206;
          auVar214._12_4_ = auVar47._12_4_ * fVar208;
          auVar179._0_4_ = auVar40._0_4_ * fVar192;
          auVar179._4_4_ = auVar40._4_4_ * fVar204;
          auVar179._8_4_ = auVar40._8_4_ * fVar206;
          auVar179._12_4_ = auVar40._12_4_ * fVar208;
          auVar45 = vfmadd231ps_fma(auVar188,auVar230,auVar50);
          auVar43 = vfmadd231ps_fma(auVar195,auVar230,auVar162);
          auVar85 = vfmadd231ps_fma(auVar214,auVar230,auVar42);
          auVar86 = vfmadd231ps_fma(auVar179,(undefined1  [16])0x0,auVar230);
          auVar39 = vshufpd_avx(auVar45,auVar45,1);
          auVar41 = vshufpd_avx(auVar43,auVar43,1);
          auVar48 = vshufpd_avx512vl(auVar85,auVar85,1);
          auVar49 = vshufpd_avx512vl(auVar86,auVar86,1);
          in_ZMM17 = ZEXT1664(auVar49);
          auVar47 = vminss_avx(auVar45,auVar43);
          auVar45 = vmaxss_avx(auVar43,auVar45);
          auVar40 = vminss_avx(auVar85,auVar86);
          auVar43 = vmaxss_avx(auVar86,auVar85);
          auVar47 = vminss_avx(auVar47,auVar40);
          auVar45 = vmaxss_avx(auVar43,auVar45);
          auVar40 = vminss_avx(auVar39,auVar41);
          auVar43 = vmaxss_avx(auVar41,auVar39);
          auVar39 = vminss_avx512f(auVar48,auVar49);
          auVar41 = vmaxss_avx512f(auVar49,auVar48);
          vmaxss_avx(auVar41,auVar43);
          auVar43 = vminss_avx512f(auVar40,auVar39);
          vucomiss_avx512f(auVar47);
          if ((bVar29 || bVar32) ||
             (auVar40 = vucomiss_avx512f(auVar36), bVar33 = bVar32, bVar29 || bVar32)) {
            auVar40 = vucomiss_avx512f(auVar36);
            auVar39 = vucomiss_avx512f(auVar43);
            auVar45 = vucomiss_avx512f(auVar36);
            bVar33 = bVar29 || bVar32;
            bVar30 = bVar29 || bVar32;
            if (!bVar29 && !bVar32) goto LAB_01add642;
            uVar10 = vcmpps_avx512vl(auVar47,auVar39,5);
            uVar11 = vcmpps_avx512vl(auVar43,auVar39,5);
            uVar25 = (uint)uVar10 & (uint)uVar11;
            bVar19 = (uVar25 & 1) == 0;
            bVar33 = (!bVar29 && !bVar32) && bVar19;
            bVar30 = (!bVar29 && !bVar32) && (uVar25 & 1) == 0;
            if ((!bVar29 && !bVar32) && bVar19) goto LAB_01add642;
          }
          else {
LAB_01add642:
            auVar39 = vxorps_avx512vl(auVar44,auVar44);
            vcmpss_avx512f(auVar47,auVar39,1);
            uVar10 = vcmpss_avx512f(auVar45,auVar39,1);
            bVar32 = (bool)((byte)uVar10 & 1);
            auVar62._0_16_ = SUB6416(ZEXT464(0x3f800000),0);
            auVar73._4_28_ = auVar62._4_28_;
            auVar73._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * 0x3f800000);
            vucomiss_avx512f(auVar73._0_16_);
            bVar30 = (bool)(!bVar33 | bVar30);
            bVar33 = bVar30 == false;
            auVar75._16_16_ = auVar62._16_16_;
            auVar75._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar74._4_28_ = auVar75._4_28_;
            auVar74._0_4_ = (uint)bVar30 * auVar39._0_4_ + (uint)!bVar30 * 0x7f800000;
            auVar44 = auVar74._0_16_;
            auVar77._16_16_ = auVar62._16_16_;
            auVar77._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar76._4_28_ = auVar77._4_28_;
            auVar76._0_4_ = (uint)bVar30 * auVar39._0_4_ + (uint)!bVar30 * -0x800000;
            auVar36 = auVar76._0_16_;
            auVar46 = vxorps_avx512vl(auVar46,auVar46);
            uVar10 = vcmpss_avx512f(auVar43,auVar39,1);
            bVar32 = (bool)((byte)uVar10 & 1);
            auVar79._16_16_ = auVar62._16_16_;
            auVar79._0_16_ = SUB6416(ZEXT464(0x3f800000),0);
            auVar78._4_28_ = auVar79._4_28_;
            auVar78._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * 0x3f800000);
            vucomiss_avx512f(auVar78._0_16_);
            if ((bVar30) || (bVar33)) {
              auVar43 = vucomiss_avx512f(auVar47);
              if ((bVar30) || (bVar33)) {
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar39 = vxorps_avx512vl(auVar47,auVar18);
                auVar43 = vsubss_avx512f(auVar43,auVar47);
                auVar43 = vdivss_avx512f(auVar39,auVar43);
                auVar47 = vsubss_avx512f(ZEXT416(0x3f800000),auVar43);
                auVar47 = vfmadd213ss_avx512f(auVar47,auVar46,auVar43);
                auVar43 = auVar47;
              }
              else {
                auVar43 = vxorps_avx512vl(auVar43,auVar43);
                vucomiss_avx512f(auVar43);
                auVar47 = ZEXT416(0x3f800000);
                if ((bVar30) || (bVar33)) {
                  auVar47 = SUB6416(ZEXT464(0xff800000),0);
                  auVar43 = SUB6416(ZEXT464(0x7f800000),0);
                }
              }
              auVar44 = vminss_avx512f(auVar44,auVar43);
              auVar36 = vmaxss_avx(auVar47,auVar36);
            }
            in_ZMM17 = ZEXT464(0x3f800000);
            uVar10 = vcmpss_avx512f(auVar40,auVar46,1);
            bVar30 = (bool)((byte)uVar10 & 1);
            auVar43 = in_ZMM17._0_16_;
            fVar192 = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * 0x3f800000);
            if ((auVar73._0_4_ != fVar192) || (NAN(auVar73._0_4_) || NAN(fVar192))) {
              fVar206 = auVar40._0_4_;
              fVar204 = auVar45._0_4_;
              if ((fVar206 != fVar204) || (NAN(fVar206) || NAN(fVar204))) {
                auVar17._8_4_ = 0x80000000;
                auVar17._0_8_ = 0x8000000080000000;
                auVar17._12_4_ = 0x80000000;
                auVar45 = vxorps_avx512vl(auVar45,auVar17);
                auVar180._0_4_ = auVar45._0_4_ / (fVar206 - fVar204);
                auVar180._4_12_ = auVar45._4_12_;
                auVar45 = vsubss_avx512f(auVar43,auVar180);
                auVar45 = vfmadd213ss_avx512f(auVar45,auVar46,auVar180);
                auVar47 = auVar45;
              }
              else if ((fVar204 != 0.0) ||
                      (auVar45 = auVar43, auVar47 = ZEXT816(0) << 0x40, NAN(fVar204))) {
                auVar45 = SUB6416(ZEXT464(0xff800000),0);
                auVar47 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar44 = vminss_avx(auVar44,auVar47);
              auVar36 = vmaxss_avx(auVar45,auVar36);
            }
            bVar30 = auVar78._0_4_ != fVar192;
            auVar45 = vminss_avx512f(auVar44,auVar43);
            auVar81._16_16_ = auVar62._16_16_;
            auVar81._0_16_ = auVar44;
            auVar80._4_28_ = auVar81._4_28_;
            auVar80._0_4_ = (uint)bVar30 * auVar45._0_4_ + (uint)!bVar30 * auVar44._0_4_;
            auVar44 = vmaxss_avx512f(auVar43,auVar36);
            auVar83._16_16_ = auVar62._16_16_;
            auVar83._0_16_ = auVar36;
            auVar82._4_28_ = auVar83._4_28_;
            auVar82._0_4_ = (uint)bVar30 * auVar44._0_4_ + (uint)!bVar30 * auVar36._0_4_;
            auVar36 = vmaxss_avx512f(auVar46,auVar80._0_16_);
            auVar44 = vminss_avx512f(auVar82._0_16_,auVar43);
            if (auVar36._0_4_ <= auVar44._0_4_) {
              auVar47 = vmaxss_avx512f(auVar46,ZEXT416((uint)(auVar36._0_4_ + -0.1)));
              auVar41 = vminss_avx512f(ZEXT416((uint)(auVar44._0_4_ + 0.1)),auVar43);
              auVar118._0_8_ = auVar50._0_8_;
              auVar118._8_8_ = auVar118._0_8_;
              auVar196._8_8_ = auVar162._0_8_;
              auVar196._0_8_ = auVar162._0_8_;
              auVar215._8_8_ = auVar42._0_8_;
              auVar215._0_8_ = auVar42._0_8_;
              auVar36 = vshufpd_avx(auVar162,auVar162,3);
              auVar44 = vshufpd_avx(auVar42,auVar42,3);
              auVar45 = vshufps_avx(auVar47,auVar41,0);
              auVar39 = vsubps_avx512vl(auVar37,auVar45);
              fVar192 = auVar45._0_4_;
              auVar153._0_4_ = fVar192 * auVar51._0_4_;
              fVar204 = auVar45._4_4_;
              auVar153._4_4_ = fVar204 * auVar51._4_4_;
              fVar206 = auVar45._8_4_;
              auVar153._8_4_ = fVar206 * auVar51._8_4_;
              fVar208 = auVar45._12_4_;
              auVar153._12_4_ = fVar208 * auVar51._12_4_;
              auVar163._0_4_ = fVar192 * auVar36._0_4_;
              auVar163._4_4_ = fVar204 * auVar36._4_4_;
              auVar163._8_4_ = fVar206 * auVar36._8_4_;
              auVar163._12_4_ = fVar208 * auVar36._12_4_;
              auVar234._0_4_ = auVar44._0_4_ * fVar192;
              auVar234._4_4_ = auVar44._4_4_ * fVar204;
              auVar234._8_4_ = auVar44._8_4_ * fVar206;
              auVar234._12_4_ = auVar44._12_4_ * fVar208;
              auVar142._0_4_ = fVar192 * auVar38._0_4_;
              auVar142._4_4_ = fVar204 * auVar38._4_4_;
              auVar142._8_4_ = fVar206 * auVar38._8_4_;
              auVar142._12_4_ = fVar208 * auVar38._12_4_;
              auVar40 = vfmadd231ps_fma(auVar153,auVar39,auVar118);
              auVar51 = vfmadd231ps_fma(auVar163,auVar39,auVar196);
              auVar38 = vfmadd231ps_fma(auVar234,auVar39,auVar215);
              auVar39 = vfmadd231ps_fma(auVar142,auVar39,ZEXT816(0));
              auVar44 = vsubss_avx512f(auVar43,auVar47);
              auVar36 = vmovshdup_avx(auVar99);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar47._0_4_)),auVar99,
                                        auVar44);
              auVar44 = vsubss_avx512f(auVar43,auVar41);
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar41._0_4_)),auVar99,
                                        auVar44);
              auVar41 = vdivss_avx512f(auVar43,ZEXT416((uint)fVar211));
              auVar36 = vsubps_avx(auVar51,auVar40);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar45 = vmulps_avx512vl(auVar36,auVar42);
              auVar36 = vsubps_avx(auVar38,auVar51);
              auVar47 = vmulps_avx512vl(auVar36,auVar42);
              auVar36 = vsubps_avx(auVar39,auVar38);
              auVar36 = vmulps_avx512vl(auVar36,auVar42);
              auVar44 = vminps_avx(auVar47,auVar36);
              auVar36 = vmaxps_avx(auVar47,auVar36);
              auVar44 = vminps_avx(auVar45,auVar44);
              auVar36 = vmaxps_avx(auVar45,auVar36);
              auVar45 = vshufpd_avx(auVar44,auVar44,3);
              auVar47 = vshufpd_avx(auVar36,auVar36,3);
              auVar44 = vminps_avx(auVar44,auVar45);
              auVar36 = vmaxps_avx(auVar36,auVar47);
              fVar211 = auVar41._0_4_;
              auVar181._0_4_ = auVar44._0_4_ * fVar211;
              auVar181._4_4_ = auVar44._4_4_ * fVar211;
              auVar181._8_4_ = auVar44._8_4_ * fVar211;
              auVar181._12_4_ = auVar44._12_4_ * fVar211;
              auVar171._0_4_ = fVar211 * auVar36._0_4_;
              auVar171._4_4_ = fVar211 * auVar36._4_4_;
              auVar171._8_4_ = fVar211 * auVar36._8_4_;
              auVar171._12_4_ = fVar211 * auVar36._12_4_;
              auVar41 = vdivss_avx512f(auVar43,ZEXT416((uint)(auVar86._0_4_ - auVar85._0_4_)));
              auVar36 = vshufpd_avx(auVar40,auVar40,3);
              auVar44 = vshufpd_avx(auVar51,auVar51,3);
              auVar45 = vshufpd_avx(auVar38,auVar38,3);
              auVar43 = vshufpd_avx(auVar39,auVar39,3);
              auVar36 = vsubps_avx(auVar36,auVar40);
              auVar47 = vsubps_avx(auVar44,auVar51);
              auVar40 = vsubps_avx(auVar45,auVar38);
              auVar43 = vsubps_avx(auVar43,auVar39);
              auVar44 = vminps_avx(auVar36,auVar47);
              auVar36 = vmaxps_avx(auVar36,auVar47);
              auVar45 = vminps_avx(auVar40,auVar43);
              auVar45 = vminps_avx(auVar44,auVar45);
              auVar44 = vmaxps_avx(auVar40,auVar43);
              auVar36 = vmaxps_avx(auVar36,auVar44);
              fVar211 = auVar41._0_4_;
              auVar216._0_4_ = fVar211 * auVar45._0_4_;
              auVar216._4_4_ = fVar211 * auVar45._4_4_;
              auVar216._8_4_ = fVar211 * auVar45._8_4_;
              auVar216._12_4_ = fVar211 * auVar45._12_4_;
              auVar197._0_4_ = fVar211 * auVar36._0_4_;
              auVar197._4_4_ = fVar211 * auVar36._4_4_;
              auVar197._8_4_ = fVar211 * auVar36._8_4_;
              auVar197._12_4_ = fVar211 * auVar36._12_4_;
              auVar43 = vinsertps_avx(auVar35,auVar85,0x10);
              auVar50 = vpermt2ps_avx512vl(auVar35,_DAT_01feecd0,auVar86);
              auVar100._0_4_ = auVar43._0_4_ + auVar50._0_4_;
              auVar100._4_4_ = auVar43._4_4_ + auVar50._4_4_;
              auVar100._8_4_ = auVar43._8_4_ + auVar50._8_4_;
              auVar100._12_4_ = auVar43._12_4_ + auVar50._12_4_;
              auVar14._8_4_ = 0x3f000000;
              auVar14._0_8_ = 0x3f0000003f000000;
              auVar14._12_4_ = 0x3f000000;
              auVar39 = vmulps_avx512vl(auVar100,auVar14);
              auVar44 = vshufps_avx(auVar39,auVar39,0x54);
              uVar84 = auVar39._0_4_;
              auVar109._4_4_ = uVar84;
              auVar109._0_4_ = uVar84;
              auVar109._8_4_ = uVar84;
              auVar109._12_4_ = uVar84;
              auVar45 = vfmadd213ps_fma(local_e8,auVar109,local_1a8);
              auVar47 = vfmadd213ps_fma(local_f8,auVar109,local_1b8);
              auVar40 = vfmadd213ps_fma(local_108,auVar109,local_1c8);
              auVar36 = vsubps_avx(auVar47,auVar45);
              auVar45 = vfmadd213ps_fma(auVar36,auVar109,auVar45);
              auVar36 = vsubps_avx(auVar40,auVar47);
              auVar36 = vfmadd213ps_fma(auVar36,auVar109,auVar47);
              auVar36 = vsubps_avx(auVar36,auVar45);
              auVar45 = vfmadd231ps_fma(auVar45,auVar36,auVar109);
              auVar51 = vmulps_avx512vl(auVar36,auVar42);
              auVar225._8_8_ = auVar45._0_8_;
              auVar225._0_8_ = auVar45._0_8_;
              auVar36 = vshufpd_avx(auVar45,auVar45,3);
              auVar45 = vshufps_avx(auVar39,auVar39,0x55);
              auVar47 = vsubps_avx(auVar36,auVar225);
              auVar40 = vfmadd231ps_fma(auVar225,auVar45,auVar47);
              auVar235._8_8_ = auVar51._0_8_;
              auVar235._0_8_ = auVar51._0_8_;
              auVar36 = vshufpd_avx(auVar51,auVar51,3);
              auVar36 = vsubps_avx512vl(auVar36,auVar235);
              auVar36 = vfmadd213ps_avx512vl(auVar36,auVar45,auVar235);
              auVar45 = vxorps_avx512vl(auVar47,auVar244._0_16_);
              auVar51 = vmovshdup_avx512vl(auVar36);
              auVar38 = vxorps_avx512vl(auVar51,auVar244._0_16_);
              auVar41 = vmovshdup_avx512vl(auVar47);
              auVar38 = vpermt2ps_avx512vl(auVar38,ZEXT416(5),auVar47);
              auVar47 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar51._0_4_ * auVar47._0_4_)),auVar36,
                                            auVar41);
              auVar45 = vpermt2ps_avx512vl(auVar36,SUB6416(ZEXT464(4),0),auVar45);
              auVar143._0_4_ = auVar47._0_4_;
              auVar143._4_4_ = auVar143._0_4_;
              auVar143._8_4_ = auVar143._0_4_;
              auVar143._12_4_ = auVar143._0_4_;
              auVar36 = vdivps_avx(auVar38,auVar143);
              auVar48 = vdivps_avx512vl(auVar45,auVar143);
              fVar211 = auVar40._0_4_;
              auVar45 = vshufps_avx(auVar40,auVar40,0x55);
              auVar226._0_4_ = fVar211 * auVar36._0_4_ + auVar45._0_4_ * auVar48._0_4_;
              auVar226._4_4_ = fVar211 * auVar36._4_4_ + auVar45._4_4_ * auVar48._4_4_;
              auVar226._8_4_ = fVar211 * auVar36._8_4_ + auVar45._8_4_ * auVar48._8_4_;
              auVar226._12_4_ = fVar211 * auVar36._12_4_ + auVar45._12_4_ * auVar48._12_4_;
              auVar41 = vsubps_avx(auVar44,auVar226);
              auVar45 = vmovshdup_avx(auVar36);
              auVar44 = vinsertps_avx(auVar181,auVar216,0x1c);
              auVar236._0_4_ = auVar45._0_4_ * auVar44._0_4_;
              auVar236._4_4_ = auVar45._4_4_ * auVar44._4_4_;
              auVar236._8_4_ = auVar45._8_4_ * auVar44._8_4_;
              auVar236._12_4_ = auVar45._12_4_ * auVar44._12_4_;
              auVar42 = vinsertps_avx512f(auVar171,auVar197,0x1c);
              auVar45 = vmulps_avx512vl(auVar45,auVar42);
              auVar38 = vminps_avx512vl(auVar236,auVar45);
              auVar40 = vmaxps_avx(auVar45,auVar236);
              auVar51 = vmovshdup_avx(auVar48);
              auVar45 = vinsertps_avx(auVar216,auVar181,0x4c);
              auVar217._0_4_ = auVar51._0_4_ * auVar45._0_4_;
              auVar217._4_4_ = auVar51._4_4_ * auVar45._4_4_;
              auVar217._8_4_ = auVar51._8_4_ * auVar45._8_4_;
              auVar217._12_4_ = auVar51._12_4_ * auVar45._12_4_;
              auVar47 = vinsertps_avx(auVar197,auVar171,0x4c);
              auVar198._0_4_ = auVar51._0_4_ * auVar47._0_4_;
              auVar198._4_4_ = auVar51._4_4_ * auVar47._4_4_;
              auVar198._8_4_ = auVar51._8_4_ * auVar47._8_4_;
              auVar198._12_4_ = auVar51._12_4_ * auVar47._12_4_;
              auVar51 = vminps_avx(auVar217,auVar198);
              auVar38 = vaddps_avx512vl(auVar38,auVar51);
              auVar51 = vmaxps_avx(auVar198,auVar217);
              auVar199._0_4_ = auVar40._0_4_ + auVar51._0_4_;
              auVar199._4_4_ = auVar40._4_4_ + auVar51._4_4_;
              auVar199._8_4_ = auVar40._8_4_ + auVar51._8_4_;
              auVar199._12_4_ = auVar40._12_4_ + auVar51._12_4_;
              auVar218._8_8_ = 0x3f80000000000000;
              auVar218._0_8_ = 0x3f80000000000000;
              auVar40 = vsubps_avx(auVar218,auVar199);
              auVar51 = vsubps_avx(auVar218,auVar38);
              auVar38 = vsubps_avx(auVar43,auVar39);
              auVar39 = vsubps_avx(auVar50,auVar39);
              fVar208 = auVar38._0_4_;
              auVar237._0_4_ = fVar208 * auVar40._0_4_;
              fVar209 = auVar38._4_4_;
              auVar237._4_4_ = fVar209 * auVar40._4_4_;
              fVar210 = auVar38._8_4_;
              auVar237._8_4_ = fVar210 * auVar40._8_4_;
              fVar101 = auVar38._12_4_;
              auVar237._12_4_ = fVar101 * auVar40._12_4_;
              auVar49 = vbroadcastss_avx512vl(auVar36);
              auVar44 = vmulps_avx512vl(auVar49,auVar44);
              auVar42 = vmulps_avx512vl(auVar49,auVar42);
              auVar49 = vminps_avx512vl(auVar44,auVar42);
              auVar42 = vmaxps_avx512vl(auVar42,auVar44);
              auVar44 = vbroadcastss_avx512vl(auVar48);
              auVar45 = vmulps_avx512vl(auVar44,auVar45);
              auVar44 = vmulps_avx512vl(auVar44,auVar47);
              auVar47 = vminps_avx512vl(auVar45,auVar44);
              auVar47 = vaddps_avx512vl(auVar49,auVar47);
              auVar38 = vmulps_avx512vl(auVar38,auVar51);
              in_ZMM17 = ZEXT1664(auVar38);
              fVar211 = auVar39._0_4_;
              auVar200._0_4_ = fVar211 * auVar40._0_4_;
              fVar192 = auVar39._4_4_;
              auVar200._4_4_ = fVar192 * auVar40._4_4_;
              fVar204 = auVar39._8_4_;
              auVar200._8_4_ = fVar204 * auVar40._8_4_;
              fVar206 = auVar39._12_4_;
              auVar200._12_4_ = fVar206 * auVar40._12_4_;
              auVar219._0_4_ = fVar211 * auVar51._0_4_;
              auVar219._4_4_ = fVar192 * auVar51._4_4_;
              auVar219._8_4_ = fVar204 * auVar51._8_4_;
              auVar219._12_4_ = fVar206 * auVar51._12_4_;
              auVar44 = vmaxps_avx(auVar44,auVar45);
              auVar172._0_4_ = auVar42._0_4_ + auVar44._0_4_;
              auVar172._4_4_ = auVar42._4_4_ + auVar44._4_4_;
              auVar172._8_4_ = auVar42._8_4_ + auVar44._8_4_;
              auVar172._12_4_ = auVar42._12_4_ + auVar44._12_4_;
              auVar182._8_8_ = 0x3f800000;
              auVar182._0_8_ = 0x3f800000;
              auVar44 = vsubps_avx(auVar182,auVar172);
              auVar45 = vsubps_avx512vl(auVar182,auVar47);
              auVar231._0_4_ = fVar208 * auVar44._0_4_;
              auVar231._4_4_ = fVar209 * auVar44._4_4_;
              auVar231._8_4_ = fVar210 * auVar44._8_4_;
              auVar231._12_4_ = fVar101 * auVar44._12_4_;
              auVar227._0_4_ = fVar208 * auVar45._0_4_;
              auVar227._4_4_ = fVar209 * auVar45._4_4_;
              auVar227._8_4_ = fVar210 * auVar45._8_4_;
              auVar227._12_4_ = fVar101 * auVar45._12_4_;
              auVar173._0_4_ = fVar211 * auVar44._0_4_;
              auVar173._4_4_ = fVar192 * auVar44._4_4_;
              auVar173._8_4_ = fVar204 * auVar44._8_4_;
              auVar173._12_4_ = fVar206 * auVar44._12_4_;
              auVar183._0_4_ = fVar211 * auVar45._0_4_;
              auVar183._4_4_ = fVar192 * auVar45._4_4_;
              auVar183._8_4_ = fVar204 * auVar45._8_4_;
              auVar183._12_4_ = fVar206 * auVar45._12_4_;
              auVar44 = vminps_avx(auVar231,auVar227);
              auVar45 = vminps_avx512vl(auVar173,auVar183);
              auVar47 = vminps_avx512vl(auVar44,auVar45);
              auVar44 = vmaxps_avx(auVar227,auVar231);
              auVar45 = vmaxps_avx(auVar183,auVar173);
              auVar45 = vmaxps_avx(auVar45,auVar44);
              auVar40 = vminps_avx512vl(auVar237,auVar38);
              auVar44 = vminps_avx(auVar200,auVar219);
              auVar44 = vminps_avx(auVar40,auVar44);
              auVar44 = vhaddps_avx(auVar47,auVar44);
              auVar40 = vmaxps_avx512vl(auVar38,auVar237);
              auVar47 = vmaxps_avx(auVar219,auVar200);
              auVar47 = vmaxps_avx(auVar47,auVar40);
              auVar45 = vhaddps_avx(auVar45,auVar47);
              auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
              auVar45 = vshufps_avx(auVar45,auVar45,0xe8);
              auVar174._0_4_ = auVar44._0_4_ + auVar41._0_4_;
              auVar174._4_4_ = auVar44._4_4_ + auVar41._4_4_;
              auVar174._8_4_ = auVar44._8_4_ + auVar41._8_4_;
              auVar174._12_4_ = auVar44._12_4_ + auVar41._12_4_;
              auVar184._0_4_ = auVar45._0_4_ + auVar41._0_4_;
              auVar184._4_4_ = auVar45._4_4_ + auVar41._4_4_;
              auVar184._8_4_ = auVar45._8_4_ + auVar41._8_4_;
              auVar184._12_4_ = auVar45._12_4_ + auVar41._12_4_;
              auVar44 = vmaxps_avx(auVar43,auVar174);
              auVar45 = vminps_avx(auVar184,auVar50);
              uVar28 = vcmpps_avx512vl(auVar45,auVar44,1);
              if ((uVar28 & 3) == 0) {
                uVar28 = vcmpps_avx512vl(auVar184,auVar50,1);
                uVar10 = vcmpps_avx512vl(auVar35,auVar174,1);
                if (((ushort)uVar10 & (ushort)uVar28 & 1) == 0) {
                  bVar20 = 0;
                }
                else {
                  auVar44 = vmovshdup_avx(auVar174);
                  bVar20 = auVar85._0_4_ < auVar44._0_4_ & (byte)(uVar28 >> 1) & 0x7f;
                }
                if (((!bVar29 || uVar5 != 0 && !bVar31) | bVar20) != 1) {
                  auVar99 = vinsertps_avx(auVar85,auVar86,0x10);
                  auVar243 = ZEXT1664(local_1d8);
                  auVar245 = ZEXT1664(local_1e8);
                  goto LAB_01adcee3;
                }
                lVar24 = 200;
                do {
                  fVar206 = auVar41._0_4_;
                  fVar204 = 1.0 - fVar206;
                  fVar211 = fVar204 * fVar204 * fVar204;
                  auVar35 = vmulss_avx512f(auVar41,ZEXT416(0x40400000));
                  fVar192 = auVar35._0_4_ * fVar204 * fVar204;
                  auVar35 = vmulss_avx512f(ZEXT416((uint)(fVar206 * fVar206)),ZEXT416(0x40400000));
                  fVar204 = fVar204 * auVar35._0_4_;
                  auVar130._4_4_ = fVar211;
                  auVar130._0_4_ = fVar211;
                  auVar130._8_4_ = fVar211;
                  auVar130._12_4_ = fVar211;
                  auVar119._4_4_ = fVar192;
                  auVar119._0_4_ = fVar192;
                  auVar119._8_4_ = fVar192;
                  auVar119._12_4_ = fVar192;
                  auVar93._4_4_ = fVar204;
                  auVar93._0_4_ = fVar204;
                  auVar93._8_4_ = fVar204;
                  auVar93._12_4_ = fVar204;
                  fVar206 = fVar206 * fVar206 * fVar206;
                  auVar154._0_4_ = fVar206 * (float)local_c8._0_4_;
                  auVar154._4_4_ = fVar206 * (float)local_c8._4_4_;
                  auVar154._8_4_ = fVar206 * fStack_c0;
                  auVar154._12_4_ = fVar206 * fStack_bc;
                  auVar35 = vfmadd231ps_fma(auVar154,local_1c8,auVar93);
                  auVar35 = vfmadd231ps_fma(auVar35,local_1b8,auVar119);
                  auVar35 = vfmadd231ps_fma(auVar35,local_1a8,auVar130);
                  auVar94._8_8_ = auVar35._0_8_;
                  auVar94._0_8_ = auVar35._0_8_;
                  auVar35 = vshufpd_avx(auVar35,auVar35,3);
                  auVar44 = vshufps_avx(auVar41,auVar41,0x55);
                  auVar35 = vsubps_avx(auVar35,auVar94);
                  auVar44 = vfmadd213ps_fma(auVar35,auVar44,auVar94);
                  fVar211 = auVar44._0_4_;
                  auVar35 = vshufps_avx(auVar44,auVar44,0x55);
                  auVar95._0_4_ = auVar36._0_4_ * fVar211 + auVar48._0_4_ * auVar35._0_4_;
                  auVar95._4_4_ = auVar36._4_4_ * fVar211 + auVar48._4_4_ * auVar35._4_4_;
                  auVar95._8_4_ = auVar36._8_4_ * fVar211 + auVar48._8_4_ * auVar35._8_4_;
                  auVar95._12_4_ = auVar36._12_4_ * fVar211 + auVar48._12_4_ * auVar35._12_4_;
                  auVar41 = vsubps_avx(auVar41,auVar95);
                  auVar35 = vandps_avx512vl(auVar44,auVar241._0_16_);
                  auVar44 = vprolq_avx512vl(auVar35,0x20);
                  auVar35 = vmaxss_avx(auVar44,auVar35);
                  if (auVar35._0_4_ < (float)local_d8._0_4_) {
                    auVar36 = vucomiss_avx512f(auVar46);
                    if (auVar35._0_4_ <= (float)local_d8._0_4_) {
                      fVar211 = auVar36._0_4_;
                      if (fVar211 <= 1.0) {
                        vmovshdup_avx(auVar36);
                        auVar35 = vucomiss_avx512f(auVar46);
                        if ((fVar211 <= 1.0) && (fVar192 = auVar35._0_4_, fVar192 <= 1.0)) {
                          auVar35 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2])
                                                  ,ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]
                                                          ),0x1c);
                          auVar51 = vinsertps_avx(auVar35,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                          aVar1 = (ray->super_RayK<1>).org.field_0;
                          auVar35 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
                          auVar35 = vdpps_avx(auVar35,auVar51,0x7f);
                          auVar46 = vsubps_avx(local_238,(undefined1  [16])aVar1);
                          auVar46 = vdpps_avx(auVar46,auVar51,0x7f);
                          auVar44 = vsubps_avx(local_248,(undefined1  [16])aVar1);
                          auVar44 = vdpps_avx(auVar44,auVar51,0x7f);
                          auVar45 = vsubps_avx(local_218,(undefined1  [16])aVar1);
                          auVar45 = vdpps_avx(auVar45,auVar51,0x7f);
                          auVar43 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
                          auVar43 = vdpps_avx(auVar43,auVar51,0x7f);
                          auVar47 = vsubps_avx(_local_258,(undefined1  [16])aVar1);
                          auVar47 = vdpps_avx(auVar47,auVar51,0x7f);
                          auVar40 = vsubps_avx(_local_268,(undefined1  [16])aVar1);
                          auVar40 = vdpps_avx(auVar40,auVar51,0x7f);
                          auVar38 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
                          auVar51 = vdpps_avx(auVar38,auVar51,0x7f);
                          fVar204 = 1.0 - fVar192;
                          auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar192)),
                                                    ZEXT416((uint)fVar204),auVar35);
                          auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * fVar192)),
                                                    ZEXT416((uint)fVar204),auVar46);
                          auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar192)),
                                                    ZEXT416((uint)fVar204),auVar44);
                          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar192 * auVar51._0_4_)),
                                                    ZEXT416((uint)fVar204),auVar45);
                          fVar208 = 1.0 - fVar211;
                          fVar192 = fVar208 * fVar208 * fVar208;
                          auVar43 = vmulss_avx512f(auVar36,ZEXT416(0x40400000));
                          fVar204 = auVar43._0_4_ * fVar208 * fVar208;
                          auVar144._0_4_ = fVar211 * fVar211;
                          auVar144._4_4_ = auVar36._4_4_ * auVar36._4_4_;
                          auVar144._8_4_ = auVar36._8_4_ * auVar36._8_4_;
                          auVar144._12_4_ = auVar36._12_4_ * auVar36._12_4_;
                          auVar43 = vmulss_avx512f(auVar144,ZEXT416(0x40400000));
                          fVar206 = fVar208 * auVar43._0_4_;
                          fVar210 = fVar211 * auVar144._0_4_;
                          auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar45._0_4_)),
                                                    ZEXT416((uint)fVar206),auVar44);
                          auVar46 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar204),auVar46);
                          auVar35 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar192),auVar35);
                          fVar209 = auVar35._0_4_;
                          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar209) &&
                             (fVar101 = (ray->super_RayK<1>).tfar, fVar209 <= fVar101)) {
                            auVar35 = vshufps_avx(auVar36,auVar36,0x55);
                            auVar44 = vsubps_avx512vl(auVar37,auVar35);
                            fVar113 = auVar35._0_4_;
                            auVar185._0_4_ = fVar113 * (float)local_208._0_4_;
                            fVar121 = auVar35._4_4_;
                            auVar185._4_4_ = fVar121 * (float)local_208._4_4_;
                            fVar122 = auVar35._8_4_;
                            auVar185._8_4_ = fVar122 * fStack_200;
                            fVar123 = auVar35._12_4_;
                            auVar185._12_4_ = fVar123 * fStack_1fc;
                            auVar189._0_4_ = fVar113 * (float)local_258._0_4_;
                            auVar189._4_4_ = fVar121 * (float)local_258._4_4_;
                            auVar189._8_4_ = fVar122 * fStack_250;
                            auVar189._12_4_ = fVar123 * fStack_24c;
                            auVar201._0_4_ = fVar113 * (float)local_268._0_4_;
                            auVar201._4_4_ = fVar121 * (float)local_268._4_4_;
                            auVar201._8_4_ = fVar122 * fStack_260;
                            auVar201._12_4_ = fVar123 * fStack_25c;
                            auVar164._0_4_ = fVar113 * (float)local_228._0_4_;
                            auVar164._4_4_ = fVar121 * (float)local_228._4_4_;
                            auVar164._8_4_ = fVar122 * fStack_220;
                            auVar164._12_4_ = fVar123 * fStack_21c;
                            auVar35 = vfmadd231ps_fma(auVar185,auVar44,local_1f8);
                            auVar37 = vfmadd231ps_fma(auVar189,auVar44,local_238);
                            auVar46 = vfmadd231ps_fma(auVar201,auVar44,local_248);
                            auVar44 = vfmadd231ps_fma(auVar164,auVar44,local_218);
                            auVar35 = vsubps_avx(auVar37,auVar35);
                            auVar37 = vsubps_avx(auVar46,auVar37);
                            auVar46 = vsubps_avx(auVar44,auVar46);
                            auVar202._0_4_ = fVar211 * auVar37._0_4_;
                            auVar202._4_4_ = fVar211 * auVar37._4_4_;
                            auVar202._8_4_ = fVar211 * auVar37._8_4_;
                            auVar202._12_4_ = fVar211 * auVar37._12_4_;
                            auVar155._4_4_ = fVar208;
                            auVar155._0_4_ = fVar208;
                            auVar155._8_4_ = fVar208;
                            auVar155._12_4_ = fVar208;
                            auVar35 = vfmadd231ps_fma(auVar202,auVar155,auVar35);
                            auVar165._0_4_ = fVar211 * auVar46._0_4_;
                            auVar165._4_4_ = fVar211 * auVar46._4_4_;
                            auVar165._8_4_ = fVar211 * auVar46._8_4_;
                            auVar165._12_4_ = fVar211 * auVar46._12_4_;
                            auVar37 = vfmadd231ps_fma(auVar165,auVar155,auVar37);
                            auVar166._0_4_ = fVar211 * auVar37._0_4_;
                            auVar166._4_4_ = fVar211 * auVar37._4_4_;
                            auVar166._8_4_ = fVar211 * auVar37._8_4_;
                            auVar166._12_4_ = fVar211 * auVar37._12_4_;
                            auVar35 = vfmadd231ps_fma(auVar166,auVar155,auVar35);
                            auVar16._8_4_ = 0x40400000;
                            auVar16._0_8_ = 0x4040000040400000;
                            auVar16._12_4_ = 0x40400000;
                            auVar35 = vmulps_avx512vl(auVar35,auVar16);
                            pGVar6 = (context->scene->geometries).items[uVar27].ptr;
                            if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                              auVar145._0_4_ = fVar210 * (float)local_148._0_4_;
                              auVar145._4_4_ = fVar210 * (float)local_148._4_4_;
                              auVar145._8_4_ = fVar210 * fStack_140;
                              auVar145._12_4_ = fVar210 * fStack_13c;
                              auVar131._4_4_ = fVar206;
                              auVar131._0_4_ = fVar206;
                              auVar131._8_4_ = fVar206;
                              auVar131._12_4_ = fVar206;
                              auVar37 = vfmadd132ps_fma(auVar131,auVar145,local_138);
                              auVar120._4_4_ = fVar204;
                              auVar120._0_4_ = fVar204;
                              auVar120._8_4_ = fVar204;
                              auVar120._12_4_ = fVar204;
                              auVar37 = vfmadd132ps_fma(auVar120,auVar37,local_128);
                              auVar110._4_4_ = fVar192;
                              auVar110._0_4_ = fVar192;
                              auVar110._8_4_ = fVar192;
                              auVar110._12_4_ = fVar192;
                              auVar44 = vfmadd132ps_fma(auVar110,auVar37,local_118);
                              auVar37 = vshufps_avx(auVar44,auVar44,0xc9);
                              auVar46 = vshufps_avx(auVar35,auVar35,0xc9);
                              auVar111._0_4_ = auVar44._0_4_ * auVar46._0_4_;
                              auVar111._4_4_ = auVar44._4_4_ * auVar46._4_4_;
                              auVar111._8_4_ = auVar44._8_4_ * auVar46._8_4_;
                              auVar111._12_4_ = auVar44._12_4_ * auVar46._12_4_;
                              auVar35 = vfmsub231ps_fma(auVar111,auVar35,auVar37);
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                (ray->super_RayK<1>).tfar = fVar209;
                                auVar37 = vshufps_avx(auVar35,auVar35,0xe9);
                                uVar10 = vmovlps_avx(auVar37);
                                *(undefined8 *)&(ray->Ng).field_0 = uVar10;
                                (ray->Ng).field_0.field_0.z = auVar35._0_4_;
                                uVar10 = vmovlps_avx(auVar36);
                                ray->u = (float)(int)uVar10;
                                ray->v = (float)(int)((ulong)uVar10 >> 0x20);
                                ray->primID = (uint)local_300;
                                ray->geomID = uVar27;
                                ray->instID[0] = context->user->instID[0];
                                ray->instPrimID[0] = context->user->instPrimID[0];
                              }
                              else {
                                auVar37 = vshufps_avx(auVar35,auVar35,0xe9);
                                local_188 = vmovlps_avx(auVar37);
                                local_180 = auVar35._0_4_;
                                local_17c = vmovlps_avx(auVar36);
                                local_174 = (uint)local_300;
                                local_170 = uVar27;
                                local_16c = context->user->instID[0];
                                local_168 = context->user->instPrimID[0];
                                (ray->super_RayK<1>).tfar = fVar209;
                                local_304 = -1;
                                local_298.valid = &local_304;
                                local_298.geometryUserPtr = pGVar6->userPtr;
                                local_298.context = context->user;
                                local_298.ray = (RTCRayN *)ray;
                                local_298.hit = (RTCHitN *)&local_188;
                                local_298.N = 1;
                                if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ade139:
                                  p_Var7 = context->args->filter;
                                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var7)(&local_298);
                                    auVar240 = ZEXT3264(_DAT_01feed20);
                                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar239 = ZEXT1664(auVar35);
                                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar238 = ZEXT3264(auVar69);
                                    auVar62._16_16_ = auVar69._16_16_;
                                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar244 = ZEXT1664(auVar35);
                                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar242 = ZEXT1664(auVar35);
                                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar241 = ZEXT1664(auVar35);
                                    if (*local_298.valid == 0) goto LAB_01ade253;
                                  }
                                  (((Vec3f *)((long)local_298.ray + 0x30))->field_0).components[0] =
                                       *(float *)local_298.hit;
                                  (((Vec3f *)((long)local_298.ray + 0x30))->field_0).field_0.y =
                                       *(float *)(local_298.hit + 4);
                                  (((Vec3f *)((long)local_298.ray + 0x30))->field_0).field_0.z =
                                       *(float *)(local_298.hit + 8);
                                  *(float *)((long)local_298.ray + 0x3c) =
                                       *(float *)(local_298.hit + 0xc);
                                  *(float *)((long)local_298.ray + 0x40) =
                                       *(float *)(local_298.hit + 0x10);
                                  *(float *)((long)local_298.ray + 0x44) =
                                       *(float *)(local_298.hit + 0x14);
                                  *(float *)((long)local_298.ray + 0x48) =
                                       *(float *)(local_298.hit + 0x18);
                                  *(float *)((long)local_298.ray + 0x4c) =
                                       *(float *)(local_298.hit + 0x1c);
                                  *(float *)((long)local_298.ray + 0x50) =
                                       *(float *)(local_298.hit + 0x20);
                                }
                                else {
                                  (*pGVar6->intersectionFilterN)(&local_298);
                                  auVar240 = ZEXT3264(_DAT_01feed20);
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                  auVar239 = ZEXT1664(auVar35);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar238 = ZEXT3264(auVar69);
                                  auVar62._16_16_ = auVar69._16_16_;
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar244 = ZEXT1664(auVar35);
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar242 = ZEXT1664(auVar35);
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar241 = ZEXT1664(auVar35);
                                  if (*local_298.valid != 0) goto LAB_01ade139;
LAB_01ade253:
                                  (ray->super_RayK<1>).tfar = fVar101;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar24 = lVar24 + -1;
                } while (lVar24 != 0);
              }
            }
          }
          auVar243 = ZEXT1664(local_1d8);
          auVar69._16_16_ = auVar62._16_16_;
          auVar69._0_16_ = local_1e8;
          auVar245 = ZEXT1664(local_1e8);
          if (uVar21 == 0) break;
        } while( true );
      }
      fVar211 = (ray->super_RayK<1>).tfar;
      auVar15._4_4_ = fVar211;
      auVar15._0_4_ = fVar211;
      auVar15._8_4_ = fVar211;
      auVar15._12_4_ = fVar211;
      uVar10 = vcmpps_avx512vl(local_158,auVar15,2);
      uVar27 = (uint)uVar34 & (uint)uVar10;
      uVar34 = (ulong)uVar27;
    } while (uVar27 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }